

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  uint uVar55;
  ulong uVar56;
  byte bVar57;
  long lVar58;
  uint uVar59;
  uint uVar60;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ulong uVar61;
  bool bVar62;
  byte bVar63;
  uint uVar64;
  bool bVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar143;
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar137 [64];
  float pp;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar161;
  undefined1 auVar160 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar162;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar163 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar179;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar204;
  float fVar205;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  float fVar234;
  undefined1 auVar232 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar233 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  float fVar242;
  float fVar249;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar247;
  float fVar248;
  undefined1 auVar246 [64];
  float fVar251;
  undefined1 auVar250 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  float s;
  undefined1 auVar258 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cfc;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar116 [32];
  undefined1 auVar136 [64];
  
  PVar2 = prim[1];
  uVar61 = (ulong)(byte)PVar2;
  fVar223 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar73 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  fVar204 = fVar223 * auVar74._0_4_;
  fVar144 = fVar223 * auVar73._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar61 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar61 * 5 + 6);
  auVar81 = vpmovsxbd_avx2(auVar13);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar61 * 6 + 6);
  auVar82 = vpmovsxbd_avx2(auVar68);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar83 = vpmovsxbd_avx2(auVar70);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar1);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar86 = vcvtdq2ps_avx(auVar90);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar61 + 6);
  auVar85 = vpmovsxbd_avx2(auVar69);
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar66 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar87 = vpmovsxbd_avx2(auVar77);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar66 + uVar61 + 6);
  auVar88 = vpmovsxbd_avx2(auVar71);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar56 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar56 + 6);
  auVar80 = vpmovsxbd_avx2(auVar72);
  auVar89 = vcvtdq2ps_avx(auVar80);
  auVar99._4_4_ = fVar144;
  auVar99._0_4_ = fVar144;
  auVar99._8_4_ = fVar144;
  auVar99._12_4_ = fVar144;
  auVar99._16_4_ = fVar144;
  auVar99._20_4_ = fVar144;
  auVar99._24_4_ = fVar144;
  auVar99._28_4_ = fVar144;
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  auVar78 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = ZEXT1632(CONCAT412(fVar223 * auVar73._12_4_,
                               CONCAT48(fVar223 * auVar73._8_4_,
                                        CONCAT44(fVar223 * auVar73._4_4_,fVar144))));
  auVar91 = vpermps_avx2(auVar101,auVar92);
  auVar79 = vpermps_avx512vl(auVar78,auVar92);
  fVar144 = auVar79._0_4_;
  fVar161 = auVar79._4_4_;
  auVar92._4_4_ = fVar161 * auVar82._4_4_;
  auVar92._0_4_ = fVar144 * auVar82._0_4_;
  fVar205 = auVar79._8_4_;
  auVar92._8_4_ = fVar205 * auVar82._8_4_;
  fVar218 = auVar79._12_4_;
  auVar92._12_4_ = fVar218 * auVar82._12_4_;
  fVar219 = auVar79._16_4_;
  auVar92._16_4_ = fVar219 * auVar82._16_4_;
  fVar220 = auVar79._20_4_;
  auVar92._20_4_ = fVar220 * auVar82._20_4_;
  fVar221 = auVar79._24_4_;
  auVar92._24_4_ = fVar221 * auVar82._24_4_;
  auVar92._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar85._4_4_ * fVar161;
  auVar90._0_4_ = auVar85._0_4_ * fVar144;
  auVar90._8_4_ = auVar85._8_4_ * fVar205;
  auVar90._12_4_ = auVar85._12_4_ * fVar218;
  auVar90._16_4_ = auVar85._16_4_ * fVar219;
  auVar90._20_4_ = auVar85._20_4_ * fVar220;
  auVar90._24_4_ = auVar85._24_4_ * fVar221;
  auVar90._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar89._4_4_ * fVar161;
  auVar80._0_4_ = auVar89._0_4_ * fVar144;
  auVar80._8_4_ = auVar89._8_4_ * fVar205;
  auVar80._12_4_ = auVar89._12_4_ * fVar218;
  auVar80._16_4_ = auVar89._16_4_ * fVar219;
  auVar80._20_4_ = auVar89._20_4_ * fVar220;
  auVar80._24_4_ = auVar89._24_4_ * fVar221;
  auVar80._28_4_ = auVar79._28_4_;
  auVar12 = vfmadd231ps_fma(auVar92,auVar91,auVar81);
  auVar13 = vfmadd231ps_fma(auVar90,auVar91,auVar86);
  auVar68 = vfmadd231ps_fma(auVar80,auVar88,auVar91);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar99,auVar84);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar99,auVar83);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar87,auVar99);
  auVar100._4_4_ = fVar204;
  auVar100._0_4_ = fVar204;
  auVar100._8_4_ = fVar204;
  auVar100._12_4_ = fVar204;
  auVar100._16_4_ = fVar204;
  auVar100._20_4_ = fVar204;
  auVar100._24_4_ = fVar204;
  auVar100._28_4_ = fVar204;
  auVar80 = ZEXT1632(CONCAT412(fVar223 * auVar74._12_4_,
                               CONCAT48(fVar223 * auVar74._8_4_,
                                        CONCAT44(fVar223 * auVar74._4_4_,fVar204))));
  auVar90 = vpermps_avx2(auVar101,auVar80);
  auVar80 = vpermps_avx512vl(auVar78,auVar80);
  fVar223 = auVar80._0_4_;
  fVar144 = auVar80._4_4_;
  auVar91._4_4_ = fVar144 * auVar82._4_4_;
  auVar91._0_4_ = fVar223 * auVar82._0_4_;
  fVar161 = auVar80._8_4_;
  auVar91._8_4_ = fVar161 * auVar82._8_4_;
  fVar205 = auVar80._12_4_;
  auVar91._12_4_ = fVar205 * auVar82._12_4_;
  fVar218 = auVar80._16_4_;
  auVar91._16_4_ = fVar218 * auVar82._16_4_;
  fVar219 = auVar80._20_4_;
  auVar91._20_4_ = fVar219 * auVar82._20_4_;
  fVar220 = auVar80._24_4_;
  auVar91._24_4_ = fVar220 * auVar82._24_4_;
  auVar91._28_4_ = 1;
  auVar78._4_4_ = auVar85._4_4_ * fVar144;
  auVar78._0_4_ = auVar85._0_4_ * fVar223;
  auVar78._8_4_ = auVar85._8_4_ * fVar161;
  auVar78._12_4_ = auVar85._12_4_ * fVar205;
  auVar78._16_4_ = auVar85._16_4_ * fVar218;
  auVar78._20_4_ = auVar85._20_4_ * fVar219;
  auVar78._24_4_ = auVar85._24_4_ * fVar220;
  auVar78._28_4_ = auVar82._28_4_;
  auVar85._4_4_ = auVar89._4_4_ * fVar144;
  auVar85._0_4_ = auVar89._0_4_ * fVar223;
  auVar85._8_4_ = auVar89._8_4_ * fVar161;
  auVar85._12_4_ = auVar89._12_4_ * fVar205;
  auVar85._16_4_ = auVar89._16_4_ * fVar218;
  auVar85._20_4_ = auVar89._20_4_ * fVar219;
  auVar85._24_4_ = auVar89._24_4_ * fVar220;
  auVar85._28_4_ = auVar80._28_4_;
  auVar70 = vfmadd231ps_fma(auVar91,auVar90,auVar81);
  auVar1 = vfmadd231ps_fma(auVar78,auVar90,auVar86);
  auVar69 = vfmadd231ps_fma(auVar85,auVar90,auVar88);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar100,auVar84);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar100,auVar83);
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar100,auVar87);
  auVar84 = vandps_avx(ZEXT1632(auVar12),auVar97);
  auVar98._8_4_ = 0x219392ef;
  auVar98._0_8_ = 0x219392ef219392ef;
  auVar98._12_4_ = 0x219392ef;
  auVar98._16_4_ = 0x219392ef;
  auVar98._20_4_ = 0x219392ef;
  auVar98._24_4_ = 0x219392ef;
  auVar98._28_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar84,auVar98,1);
  bVar62 = (bool)((byte)uVar66 & 1);
  auVar79._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar12._0_4_;
  bVar62 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar12._4_4_;
  bVar62 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar12._8_4_;
  bVar62 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar12._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar13),auVar97);
  uVar66 = vcmpps_avx512vl(auVar84,auVar98,1);
  bVar62 = (bool)((byte)uVar66 & 1);
  auVar93._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar13._0_4_;
  bVar62 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar13._4_4_;
  bVar62 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar13._8_4_;
  bVar62 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar13._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar68),auVar97);
  uVar66 = vcmpps_avx512vl(auVar84,auVar98,1);
  bVar62 = (bool)((byte)uVar66 & 1);
  auVar84._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._0_4_;
  bVar62 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._4_4_;
  bVar62 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._8_4_;
  bVar62 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar259 = ZEXT3264(auVar82);
  auVar83 = vfnmadd213ps_avx512vl(auVar79,auVar81,auVar82);
  auVar12 = vfmadd132ps_fma(auVar83,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar93);
  auVar83 = vfnmadd213ps_avx512vl(auVar93,auVar81,auVar82);
  auVar13 = vfmadd132ps_fma(auVar83,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar84);
  auVar84 = vfnmadd213ps_avx512vl(auVar84,auVar81,auVar82);
  auVar68 = vfmadd132ps_fma(auVar84,auVar81,auVar81);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar87._4_4_ = auVar12._4_4_ * auVar84._4_4_;
  auVar87._0_4_ = auVar12._0_4_ * auVar84._0_4_;
  auVar87._8_4_ = auVar12._8_4_ * auVar84._8_4_;
  auVar87._12_4_ = auVar12._12_4_ * auVar84._12_4_;
  auVar87._16_4_ = auVar84._16_4_ * 0.0;
  auVar87._20_4_ = auVar84._20_4_ * 0.0;
  auVar87._24_4_ = auVar84._24_4_ * 0.0;
  auVar87._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 9 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar85 = vpbroadcastd_avx512vl();
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar96._0_4_ = auVar12._0_4_ * auVar84._0_4_;
  auVar96._4_4_ = auVar12._4_4_ * auVar84._4_4_;
  auVar96._8_4_ = auVar12._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar12._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar84._16_4_ * 0.0;
  auVar96._20_4_ = auVar84._20_4_ * 0.0;
  auVar96._24_4_ = auVar84._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar2 * 0x10 + uVar61 * -2 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar1));
  auVar88._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar88._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar88._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar88._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar88._16_4_ = auVar84._16_4_ * 0.0;
  auVar88._20_4_ = auVar84._20_4_ * 0.0;
  auVar88._24_4_ = auVar84._24_4_ * 0.0;
  auVar88._28_4_ = auVar84._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar81);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar1));
  auVar95._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar95._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar95._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar95._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar95._16_4_ = auVar84._16_4_ * 0.0;
  auVar95._20_4_ = auVar84._20_4_ * 0.0;
  auVar95._24_4_ = auVar84._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 + uVar61 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar69));
  auVar89._4_4_ = auVar84._4_4_ * auVar68._4_4_;
  auVar89._0_4_ = auVar84._0_4_ * auVar68._0_4_;
  auVar89._8_4_ = auVar84._8_4_ * auVar68._8_4_;
  auVar89._12_4_ = auVar84._12_4_ * auVar68._12_4_;
  auVar89._16_4_ = auVar84._16_4_ * 0.0;
  auVar89._20_4_ = auVar84._20_4_ * 0.0;
  auVar89._24_4_ = auVar84._24_4_ * 0.0;
  auVar89._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar61 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar69));
  auVar94._0_4_ = auVar68._0_4_ * auVar84._0_4_;
  auVar94._4_4_ = auVar68._4_4_ * auVar84._4_4_;
  auVar94._8_4_ = auVar68._8_4_ * auVar84._8_4_;
  auVar94._12_4_ = auVar68._12_4_ * auVar84._12_4_;
  auVar94._16_4_ = auVar84._16_4_ * 0.0;
  auVar94._20_4_ = auVar84._20_4_ * 0.0;
  auVar94._24_4_ = auVar84._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar87,auVar96);
  auVar81 = vpminsd_avx2(auVar88,auVar95);
  auVar84 = vmaxps_avx(auVar84,auVar81);
  auVar81 = vpminsd_avx2(auVar89,auVar94);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar82._4_4_ = uVar162;
  auVar82._0_4_ = uVar162;
  auVar82._8_4_ = uVar162;
  auVar82._12_4_ = uVar162;
  auVar82._16_4_ = uVar162;
  auVar82._20_4_ = uVar162;
  auVar82._24_4_ = uVar162;
  auVar82._28_4_ = uVar162;
  auVar81 = vmaxps_avx512vl(auVar81,auVar82);
  auVar84 = vmaxps_avx(auVar84,auVar81);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  auVar81._16_4_ = 0x3f7ffffa;
  auVar81._20_4_ = 0x3f7ffffa;
  auVar81._24_4_ = 0x3f7ffffa;
  auVar81._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar84,auVar81);
  auVar84 = vpmaxsd_avx2(auVar87,auVar96);
  auVar81 = vpmaxsd_avx2(auVar88,auVar95);
  auVar84 = vminps_avx(auVar84,auVar81);
  auVar81 = vpmaxsd_avx2(auVar89,auVar94);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar83._4_4_ = uVar162;
  auVar83._0_4_ = uVar162;
  auVar83._8_4_ = uVar162;
  auVar83._12_4_ = uVar162;
  auVar83._16_4_ = uVar162;
  auVar83._20_4_ = uVar162;
  auVar83._24_4_ = uVar162;
  auVar83._28_4_ = uVar162;
  auVar81 = vminps_avx512vl(auVar81,auVar83);
  auVar84 = vminps_avx(auVar84,auVar81);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar86._16_4_ = 0x3f800003;
  auVar86._20_4_ = 0x3f800003;
  auVar86._24_4_ = 0x3f800003;
  auVar86._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar86);
  uVar15 = vpcmpgtd_avx512vl(auVar85,_DAT_01fe9900);
  uVar14 = vcmpps_avx512vl(local_680,auVar84,2);
  if ((byte)((byte)uVar14 & (byte)uVar15) == 0) {
    return false;
  }
  local_8e8 = (ulong)(byte)((byte)uVar14 & (byte)uVar15);
  auVar160 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar160);
  local_8f0 = prim;
LAB_01d1ce7b:
  lVar58 = 0;
  for (uVar66 = local_8e8; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar64 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar64].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar58 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar58 = *(long *)&pGVar3[1].time_range.upper;
  auVar12 = *(undefined1 (*) [16])(lVar58 + (long)p_Var4 * uVar66);
  auVar13 = *(undefined1 (*) [16])(lVar58 + (uVar66 + 1) * (long)p_Var4);
  local_8e8 = local_8e8 - 1 & local_8e8;
  if (local_8e8 != 0) {
    uVar61 = local_8e8 - 1 & local_8e8;
    for (uVar56 = local_8e8; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar70 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar254._4_4_ = uVar162;
  auVar254._0_4_ = uVar162;
  auVar254._8_4_ = uVar162;
  auVar254._12_4_ = uVar162;
  local_820._16_4_ = uVar162;
  local_820._0_16_ = auVar254;
  local_820._20_4_ = uVar162;
  local_820._24_4_ = uVar162;
  local_820._28_4_ = uVar162;
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar76._4_4_ = uVar162;
  auVar76._0_4_ = uVar162;
  auVar76._8_4_ = uVar162;
  auVar76._12_4_ = uVar162;
  local_840._16_4_ = uVar162;
  local_840._0_16_ = auVar76;
  local_840._20_4_ = uVar162;
  local_840._24_4_ = uVar162;
  local_840._28_4_ = uVar162;
  auVar68 = vunpcklps_avx(auVar254,auVar76);
  fVar223 = *(float *)(ray + k * 4 + 0x180);
  auVar257._4_4_ = fVar223;
  auVar257._0_4_ = fVar223;
  auVar257._8_4_ = fVar223;
  auVar257._12_4_ = fVar223;
  local_860._16_4_ = fVar223;
  local_860._0_16_ = auVar257;
  local_860._20_4_ = fVar223;
  local_860._24_4_ = fVar223;
  local_860._28_4_ = fVar223;
  local_9d0 = vinsertps_avx(auVar68,auVar257,0x28);
  auVar74._0_4_ = auVar12._0_4_ + auVar13._0_4_;
  auVar74._4_4_ = auVar12._4_4_ + auVar13._4_4_;
  auVar74._8_4_ = auVar12._8_4_ + auVar13._8_4_;
  auVar74._12_4_ = auVar12._12_4_ + auVar13._12_4_;
  auVar73._8_4_ = 0x3f000000;
  auVar73._0_8_ = 0x3f0000003f000000;
  auVar73._12_4_ = 0x3f000000;
  auVar68 = vmulps_avx512vl(auVar74,auVar73);
  auVar68 = vsubps_avx(auVar68,auVar70);
  auVar68 = vdpps_avx(auVar68,local_9d0,0x7f);
  fVar144 = *(float *)(ray + k * 4 + 0xc0);
  auVar252 = ZEXT464((uint)fVar144);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar253 = ZEXT1664(local_9e0);
  auVar75._4_12_ = ZEXT812(0) << 0x20;
  auVar75._0_4_ = local_9e0._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar75);
  auVar1 = vfnmadd213ss_fma(auVar69,local_9e0,ZEXT416(0x40000000));
  fVar161 = auVar68._0_4_ * auVar69._0_4_ * auVar1._0_4_;
  auVar232._4_4_ = fVar161;
  auVar232._0_4_ = fVar161;
  auVar232._8_4_ = fVar161;
  auVar232._12_4_ = fVar161;
  auVar68 = vfmadd231ps_fma(auVar70,local_9d0,auVar232);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar58 + (uVar66 + 2) * (long)p_Var4),auVar68);
  auVar241 = ZEXT1664(auVar70);
  auVar13 = vsubps_avx(auVar13,auVar68);
  auVar246 = ZEXT1664(auVar13);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar58 + (uVar66 + 3) * (long)p_Var4),auVar68);
  auVar84 = vbroadcastss_avx512vl(auVar12);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  local_960 = ZEXT1632(auVar12);
  auVar81 = vpermps_avx512vl(auVar103,local_960);
  auVar104._8_4_ = 2;
  auVar104._0_8_ = 0x200000002;
  auVar104._12_4_ = 2;
  auVar104._16_4_ = 2;
  auVar104._20_4_ = 2;
  auVar104._24_4_ = 2;
  auVar104._28_4_ = 2;
  auVar82 = vpermps_avx512vl(auVar104,local_960);
  auVar105._8_4_ = 3;
  auVar105._0_8_ = 0x300000003;
  auVar105._12_4_ = 3;
  auVar105._16_4_ = 3;
  auVar105._20_4_ = 3;
  auVar105._24_4_ = 3;
  auVar105._28_4_ = 3;
  auVar83 = vpermps_avx512vl(auVar105,local_960);
  auVar86 = vbroadcastss_avx512vl(auVar13);
  local_9a0 = ZEXT1632(auVar13);
  auVar85 = vpermps_avx512vl(auVar103,local_9a0);
  auVar87 = vpermps_avx512vl(auVar104,local_9a0);
  auVar88 = vpermps_avx512vl(auVar105,local_9a0);
  auVar89 = vbroadcastss_avx512vl(auVar70);
  local_980 = ZEXT1632(auVar70);
  auVar90 = vpermps_avx512vl(auVar103,local_980);
  local_5e0 = vpermps_avx512vl(auVar104,local_980);
  local_560 = vpermps_avx2(auVar105,local_980);
  uVar162 = auVar68._0_4_;
  local_600._4_4_ = uVar162;
  local_600._0_4_ = uVar162;
  local_600._8_4_ = uVar162;
  local_600._12_4_ = uVar162;
  local_600._16_4_ = uVar162;
  local_600._20_4_ = uVar162;
  local_600._24_4_ = uVar162;
  local_600._28_4_ = uVar162;
  _local_9c0 = ZEXT1632(auVar68);
  local_5c0 = vpermps_avx512vl(auVar103,_local_9c0);
  local_580 = vpermps_avx2(auVar104,_local_9c0);
  local_640 = vpermps_avx2(auVar105,_local_9c0);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar223 * fVar223)),local_840,local_840);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_820,local_820);
  local_5a0._0_4_ = auVar12._0_4_;
  local_5a0._4_4_ = local_5a0._0_4_;
  local_5a0._8_4_ = local_5a0._0_4_;
  local_5a0._12_4_ = local_5a0._0_4_;
  local_5a0._16_4_ = local_5a0._0_4_;
  local_5a0._20_4_ = local_5a0._0_4_;
  local_5a0._24_4_ = local_5a0._0_4_;
  local_5a0._28_4_ = local_5a0._0_4_;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  auVar102._16_4_ = 0x7fffffff;
  auVar102._20_4_ = 0x7fffffff;
  auVar102._24_4_ = 0x7fffffff;
  auVar102._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_5a0,auVar102);
  local_930 = ZEXT416((uint)fVar161);
  local_660 = fVar144 - fVar161;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar160 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar160);
  local_cfc = 1;
  uVar59 = 0;
  bVar62 = false;
  auVar160 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar160);
  auVar12 = vsqrtss_avx(local_9e0,local_9e0);
  auVar13 = vsqrtss_avx(local_9e0,local_9e0);
  local_730 = ZEXT816(0x3f80000000000000);
  local_620 = local_5c0;
  do {
    auVar68 = vmovshdup_avx(local_730);
    auVar68 = vsubps_avx(auVar68,local_730);
    auVar153._0_4_ = auVar68._0_4_;
    fVar223 = auVar153._0_4_ * 0.04761905;
    uVar162 = local_730._0_4_;
    auVar226._4_4_ = uVar162;
    auVar226._0_4_ = uVar162;
    auVar226._8_4_ = uVar162;
    auVar226._12_4_ = uVar162;
    auVar226._16_4_ = uVar162;
    auVar226._20_4_ = uVar162;
    auVar226._24_4_ = uVar162;
    auVar226._28_4_ = uVar162;
    auVar153._4_4_ = auVar153._0_4_;
    auVar153._8_4_ = auVar153._0_4_;
    auVar153._12_4_ = auVar153._0_4_;
    auVar153._16_4_ = auVar153._0_4_;
    auVar153._20_4_ = auVar153._0_4_;
    auVar153._24_4_ = auVar153._0_4_;
    auVar153._28_4_ = auVar153._0_4_;
    auVar68 = vfmadd231ps_fma(auVar226,auVar153,_DAT_01faff20);
    auVar258 = auVar259._0_32_;
    auVar80 = vsubps_avx512vl(auVar258,ZEXT1632(auVar68));
    fVar205 = auVar68._0_4_;
    fVar218 = auVar68._4_4_;
    fVar219 = auVar68._8_4_;
    fVar220 = auVar68._12_4_;
    fVar204 = auVar80._0_4_;
    fVar222 = auVar80._4_4_;
    fVar234 = auVar80._8_4_;
    fVar235 = auVar80._12_4_;
    fVar236 = auVar80._16_4_;
    fVar179 = auVar80._20_4_;
    fVar237 = auVar80._24_4_;
    auVar112._4_4_ = fVar222 * fVar222 * -fVar218;
    auVar112._0_4_ = fVar204 * fVar204 * -fVar205;
    auVar112._8_4_ = fVar234 * fVar234 * -fVar219;
    auVar112._12_4_ = fVar235 * fVar235 * -fVar220;
    auVar112._16_4_ = fVar236 * fVar236 * -0.0;
    auVar112._20_4_ = fVar179 * fVar179 * -0.0;
    auVar112._24_4_ = fVar237 * fVar237 * -0.0;
    auVar112._28_4_ = 0x80000000;
    auVar160._28_36_ = auVar241._28_36_;
    auVar160._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar205 * fVar205)
                                    )));
    fVar242 = fVar205 * 3.0;
    fVar247 = fVar218 * 3.0;
    fVar248 = fVar219 * 3.0;
    fVar249 = fVar220 * 3.0;
    auVar241._28_36_ = auVar246._28_36_;
    auVar241._0_28_ = ZEXT1628(CONCAT412(fVar249,CONCAT48(fVar248,CONCAT44(fVar247,fVar242))));
    fVar251 = auVar246._28_4_ + -5.0;
    auVar174._0_4_ = (fVar242 + -5.0) * fVar205 * fVar205 + 2.0;
    auVar174._4_4_ = (fVar247 + -5.0) * fVar218 * fVar218 + 2.0;
    auVar174._8_4_ = (fVar248 + -5.0) * fVar219 * fVar219 + 2.0;
    auVar174._12_4_ = (fVar249 + -5.0) * fVar220 * fVar220 + 2.0;
    auVar174._16_4_ = 0x40000000;
    auVar174._20_4_ = 0x40000000;
    auVar174._24_4_ = 0x40000000;
    auVar174._28_4_ = 0x40000000;
    auVar246._0_4_ = fVar204 * fVar204;
    auVar246._4_4_ = fVar222 * fVar222;
    auVar246._8_4_ = fVar234 * fVar234;
    auVar246._12_4_ = fVar235 * fVar235;
    auVar246._16_4_ = fVar236 * fVar236;
    auVar246._20_4_ = fVar179 * fVar179;
    auVar246._28_36_ = auVar252._28_36_;
    auVar246._24_4_ = fVar237 * fVar237;
    auVar198._0_4_ = auVar246._0_4_ * (fVar204 * 3.0 + -5.0) + 2.0;
    auVar198._4_4_ = auVar246._4_4_ * (fVar222 * 3.0 + -5.0) + 2.0;
    auVar198._8_4_ = auVar246._8_4_ * (fVar234 * 3.0 + -5.0) + 2.0;
    auVar198._12_4_ = auVar246._12_4_ * (fVar235 * 3.0 + -5.0) + 2.0;
    auVar198._16_4_ = auVar246._16_4_ * (fVar236 * 3.0 + -5.0) + 2.0;
    auVar198._20_4_ = auVar246._20_4_ * (fVar179 * 3.0 + -5.0) + 2.0;
    auVar198._24_4_ = auVar246._24_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar198._28_4_ = auVar253._28_4_ + -5.0 + 2.0;
    fVar221 = auVar80._28_4_;
    auVar113._4_4_ = fVar218 * fVar218 * -fVar222;
    auVar113._0_4_ = fVar205 * fVar205 * -fVar204;
    auVar113._8_4_ = fVar219 * fVar219 * -fVar234;
    auVar113._12_4_ = fVar220 * fVar220 * -fVar235;
    auVar113._16_4_ = -fVar236 * 0.0 * 0.0;
    auVar113._20_4_ = -fVar179 * 0.0 * 0.0;
    auVar113._24_4_ = -fVar237 * 0.0 * 0.0;
    auVar113._28_4_ = -fVar221;
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar80 = vmulps_avx512vl(auVar112,auVar78);
    auVar79 = vmulps_avx512vl(auVar174,auVar78);
    auVar91 = vmulps_avx512vl(auVar198,auVar78);
    auVar92 = vmulps_avx512vl(auVar113,auVar78);
    auVar93 = vmulps_avx512vl(local_600,auVar92);
    auVar94 = vmulps_avx512vl(local_620,auVar92);
    auVar95 = vmulps_avx512vl(local_580,auVar92);
    auVar114._4_4_ = local_640._4_4_ * auVar92._4_4_;
    auVar114._0_4_ = local_640._0_4_ * auVar92._0_4_;
    auVar114._8_4_ = local_640._8_4_ * auVar92._8_4_;
    auVar114._12_4_ = local_640._12_4_ * auVar92._12_4_;
    auVar114._16_4_ = local_640._16_4_ * auVar92._16_4_;
    auVar114._20_4_ = local_640._20_4_ * auVar92._20_4_;
    auVar114._24_4_ = local_640._24_4_ * auVar92._24_4_;
    auVar114._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar89);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar90);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar91,local_5e0);
    auVar91 = vfmadd231ps_avx512vl(auVar114,local_560,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar79,auVar86);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar79,auVar85);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar79,auVar87);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar79);
    local_880 = vfmadd231ps_avx512vl(auVar92,auVar80,auVar84);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar80,auVar81);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar80,auVar82);
    auVar95 = vfmadd231ps_avx512vl(auVar91,auVar83,auVar80);
    auVar115._4_4_ = (fVar222 + fVar222) * fVar218;
    auVar115._0_4_ = (fVar204 + fVar204) * fVar205;
    auVar115._8_4_ = (fVar234 + fVar234) * fVar219;
    auVar115._12_4_ = (fVar235 + fVar235) * fVar220;
    auVar115._16_4_ = (fVar236 + fVar236) * 0.0;
    auVar115._20_4_ = (fVar179 + fVar179) * 0.0;
    auVar115._24_4_ = (fVar237 + fVar237) * 0.0;
    auVar115._28_4_ = auVar79._28_4_;
    auVar80 = vsubps_avx(auVar115,auVar246._0_32_);
    auVar227._0_28_ =
         ZEXT1628(CONCAT412((fVar220 + fVar220) * (fVar249 + -5.0) + fVar249 * fVar220,
                            CONCAT48((fVar219 + fVar219) * (fVar248 + -5.0) + fVar248 * fVar219,
                                     CONCAT44((fVar218 + fVar218) * (fVar247 + -5.0) +
                                              fVar247 * fVar218,
                                              (fVar205 + fVar205) * (fVar242 + -5.0) +
                                              fVar242 * fVar205))));
    auVar227._28_4_ = fVar251 + 0.0;
    auVar106._8_4_ = 0x40000000;
    auVar106._0_8_ = 0x4000000040000000;
    auVar106._12_4_ = 0x40000000;
    auVar106._16_4_ = 0x40000000;
    auVar106._20_4_ = 0x40000000;
    auVar106._24_4_ = 0x40000000;
    auVar106._28_4_ = 0x40000000;
    auVar91 = vaddps_avx512vl(auVar241._0_32_,auVar106);
    auVar118._4_4_ = (fVar222 + fVar222) * auVar91._4_4_;
    auVar118._0_4_ = (fVar204 + fVar204) * auVar91._0_4_;
    auVar118._8_4_ = (fVar234 + fVar234) * auVar91._8_4_;
    auVar118._12_4_ = (fVar235 + fVar235) * auVar91._12_4_;
    auVar118._16_4_ = (fVar236 + fVar236) * auVar91._16_4_;
    auVar118._20_4_ = (fVar179 + fVar179) * auVar91._20_4_;
    auVar118._24_4_ = (fVar237 + fVar237) * auVar91._24_4_;
    auVar118._28_4_ = auVar91._28_4_;
    auVar119._4_4_ = fVar222 * 3.0 * fVar222;
    auVar119._0_4_ = fVar204 * 3.0 * fVar204;
    auVar119._8_4_ = fVar234 * 3.0 * fVar234;
    auVar119._12_4_ = fVar235 * 3.0 * fVar235;
    auVar119._16_4_ = fVar236 * 3.0 * fVar236;
    auVar119._20_4_ = fVar179 * 3.0 * fVar179;
    auVar119._24_4_ = fVar237 * 3.0 * fVar237;
    auVar119._28_4_ = fVar221;
    auVar91 = vsubps_avx(auVar118,auVar119);
    auVar92 = vsubps_avx(auVar160._0_32_,auVar115);
    auVar80 = vmulps_avx512vl(auVar80,auVar78);
    auVar96 = vmulps_avx512vl(auVar227,auVar78);
    auVar91 = vmulps_avx512vl(auVar91,auVar78);
    auVar92 = vmulps_avx512vl(auVar92,auVar78);
    auVar120._4_4_ = local_600._4_4_ * auVar92._4_4_;
    auVar120._0_4_ = local_600._0_4_ * auVar92._0_4_;
    auVar120._8_4_ = local_600._8_4_ * auVar92._8_4_;
    auVar120._12_4_ = local_600._12_4_ * auVar92._12_4_;
    auVar120._16_4_ = local_600._16_4_ * auVar92._16_4_;
    auVar120._20_4_ = local_600._20_4_ * auVar92._20_4_;
    auVar120._24_4_ = local_600._24_4_ * auVar92._24_4_;
    auVar120._28_4_ = fVar251;
    auVar78 = vmulps_avx512vl(local_620,auVar92);
    auVar97 = vmulps_avx512vl(local_580,auVar92);
    auVar121._4_4_ = local_640._4_4_ * auVar92._4_4_;
    auVar121._0_4_ = local_640._0_4_ * auVar92._0_4_;
    auVar121._8_4_ = local_640._8_4_ * auVar92._8_4_;
    auVar121._12_4_ = local_640._12_4_ * auVar92._12_4_;
    auVar121._16_4_ = local_640._16_4_ * auVar92._16_4_;
    auVar121._20_4_ = local_640._20_4_ * auVar92._20_4_;
    auVar121._24_4_ = local_640._24_4_ * auVar92._24_4_;
    auVar121._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar120,auVar91,auVar89);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar91,auVar90);
    auVar68 = vfmadd231ps_fma(auVar97,auVar91,local_5e0);
    auVar91 = vfmadd231ps_avx512vl(auVar121,local_560,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar86);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar96,auVar85);
    auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),auVar96,auVar87);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar96);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar80,auVar84);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar80,auVar81);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar80,auVar82);
    auVar80 = vfmadd231ps_avx512vl(auVar91,auVar83,auVar80);
    auVar32._4_4_ = auVar92._4_4_ * fVar223;
    auVar32._0_4_ = auVar92._0_4_ * fVar223;
    auVar32._8_4_ = auVar92._8_4_ * fVar223;
    auVar32._12_4_ = auVar92._12_4_ * fVar223;
    auVar32._16_4_ = auVar92._16_4_ * fVar223;
    auVar32._20_4_ = auVar92._20_4_ * fVar223;
    auVar32._24_4_ = auVar92._24_4_ * fVar223;
    auVar32._28_4_ = fVar221 + fVar221;
    auVar33._4_4_ = auVar78._4_4_ * fVar223;
    auVar33._0_4_ = auVar78._0_4_ * fVar223;
    auVar33._8_4_ = auVar78._8_4_ * fVar223;
    auVar33._12_4_ = auVar78._12_4_ * fVar223;
    auVar33._16_4_ = auVar78._16_4_ * fVar223;
    auVar33._20_4_ = auVar78._20_4_ * fVar223;
    auVar33._24_4_ = auVar78._24_4_ * fVar223;
    auVar33._28_4_ = auVar79._28_4_;
    auVar34._4_4_ = auVar96._4_4_ * fVar223;
    auVar34._0_4_ = auVar96._0_4_ * fVar223;
    auVar34._8_4_ = auVar96._8_4_ * fVar223;
    auVar34._12_4_ = auVar96._12_4_ * fVar223;
    auVar34._16_4_ = auVar96._16_4_ * fVar223;
    auVar34._20_4_ = auVar96._20_4_ * fVar223;
    auVar34._24_4_ = auVar96._24_4_ * fVar223;
    auVar34._28_4_ = 0;
    fVar205 = fVar223 * auVar80._0_4_;
    fVar218 = fVar223 * auVar80._4_4_;
    auVar35._4_4_ = fVar218;
    auVar35._0_4_ = fVar205;
    fVar219 = fVar223 * auVar80._8_4_;
    auVar35._8_4_ = fVar219;
    fVar220 = fVar223 * auVar80._12_4_;
    auVar35._12_4_ = fVar220;
    fVar221 = fVar223 * auVar80._16_4_;
    auVar35._16_4_ = fVar221;
    fVar204 = fVar223 * auVar80._20_4_;
    auVar35._20_4_ = fVar204;
    fVar222 = fVar223 * auVar80._24_4_;
    auVar35._24_4_ = fVar222;
    auVar35._28_4_ = fVar223;
    auVar68 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
    auVar79 = vpermt2ps_avx512vl(local_880,_DAT_01feed00,ZEXT1632(auVar68));
    auVar96 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,ZEXT1632(auVar68));
    auVar252 = ZEXT3264(auVar96);
    auVar92 = ZEXT1632(auVar68);
    auVar97 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,auVar92);
    auVar253 = ZEXT3264(auVar97);
    auVar228._0_4_ = auVar95._0_4_ + fVar205;
    auVar228._4_4_ = auVar95._4_4_ + fVar218;
    auVar228._8_4_ = auVar95._8_4_ + fVar219;
    auVar228._12_4_ = auVar95._12_4_ + fVar220;
    auVar228._16_4_ = auVar95._16_4_ + fVar221;
    auVar228._20_4_ = auVar95._20_4_ + fVar204;
    auVar228._24_4_ = auVar95._24_4_ + fVar222;
    auVar228._28_4_ = auVar95._28_4_ + fVar223;
    auVar80 = vmaxps_avx(auVar95,auVar228);
    auVar91 = vminps_avx(auVar95,auVar228);
    auVar95 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,auVar92);
    auVar98 = vpermt2ps_avx512vl(auVar32,_DAT_01feed00,auVar92);
    auVar246 = ZEXT3264(auVar98);
    auVar99 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,auVar92);
    auVar112 = ZEXT1632(auVar68);
    auVar100 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,auVar112);
    auVar92 = vpermt2ps_avx512vl(auVar35,_DAT_01feed00,auVar112);
    auVar101 = vsubps_avx512vl(auVar95,auVar92);
    auVar102 = vsubps_avx512vl(auVar79,local_880);
    auVar241 = ZEXT3264(auVar102);
    auVar92 = vsubps_avx(auVar96,auVar93);
    auVar78 = vsubps_avx(auVar97,auVar94);
    auVar103 = vmulps_avx512vl(auVar92,auVar34);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar33,auVar78);
    auVar104 = vmulps_avx512vl(auVar78,auVar32);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar34,auVar102);
    auVar105 = vmulps_avx512vl(auVar102,auVar33);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar32,auVar92);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar78,auVar78);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar92);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar102);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar258);
    auVar105 = vfmadd132ps_avx512vl(auVar106,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar106 = vmulps_avx512vl(auVar92,auVar100);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar99,auVar78);
    auVar107 = vmulps_avx512vl(auVar78,auVar98);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar102);
    auVar108 = vmulps_avx512vl(auVar102,auVar99);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar98,auVar92);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar101,auVar95);
    auVar80 = vmaxps_avx512vl(auVar80,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar80);
    auVar80 = vminps_avx512vl(auVar101,auVar95);
    auVar80 = vminps_avx(auVar91,auVar80);
    auVar80 = vsubps_avx512vl(auVar80,auVar103);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar105,auVar107);
    auVar108._8_4_ = 0x3f7ffffc;
    auVar108._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar108._12_4_ = 0x3f7ffffc;
    auVar108._16_4_ = 0x3f7ffffc;
    auVar108._20_4_ = 0x3f7ffffc;
    auVar108._24_4_ = 0x3f7ffffc;
    auVar108._28_4_ = 0x3f7ffffc;
    auVar80 = vmulps_avx512vl(auVar80,auVar108);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    auVar95 = vrsqrt14ps_avx512vl(auVar104);
    auVar109._8_4_ = 0xbf000000;
    auVar109._0_8_ = 0xbf000000bf000000;
    auVar109._12_4_ = 0xbf000000;
    auVar109._16_4_ = 0xbf000000;
    auVar109._20_4_ = 0xbf000000;
    auVar109._24_4_ = 0xbf000000;
    auVar109._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar104,auVar109);
    fVar223 = auVar95._0_4_;
    fVar205 = auVar95._4_4_;
    fVar218 = auVar95._8_4_;
    fVar219 = auVar95._12_4_;
    fVar220 = auVar95._16_4_;
    fVar221 = auVar95._20_4_;
    fVar204 = auVar95._24_4_;
    auVar36._4_4_ = fVar205 * fVar205 * fVar205 * auVar101._4_4_;
    auVar36._0_4_ = fVar223 * fVar223 * fVar223 * auVar101._0_4_;
    auVar36._8_4_ = fVar218 * fVar218 * fVar218 * auVar101._8_4_;
    auVar36._12_4_ = fVar219 * fVar219 * fVar219 * auVar101._12_4_;
    auVar36._16_4_ = fVar220 * fVar220 * fVar220 * auVar101._16_4_;
    auVar36._20_4_ = fVar221 * fVar221 * fVar221 * auVar101._20_4_;
    auVar36._24_4_ = fVar204 * fVar204 * fVar204 * auVar101._24_4_;
    auVar36._28_4_ = auVar105._28_4_;
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar36,auVar95,auVar110);
    auVar101 = vmulps_avx512vl(auVar102,auVar95);
    auVar103 = vmulps_avx512vl(auVar92,auVar95);
    auVar104 = vmulps_avx512vl(auVar78,auVar95);
    auVar105 = vsubps_avx512vl(auVar112,local_880);
    local_800._0_32_ = auVar93;
    auVar106 = vsubps_avx512vl(auVar112,auVar93);
    auVar107 = vsubps_avx512vl(auVar112,auVar94);
    auVar108 = vmulps_avx512vl(local_860,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_840,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_820,auVar105);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar110 = vmulps_avx512vl(local_860,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_840);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,local_820);
    auVar104 = vmulps_avx512vl(auVar107,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar103);
    auVar101 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar101);
    auVar103 = vmulps_avx512vl(auVar110,auVar110);
    auVar104 = vsubps_avx512vl(local_5a0,auVar103);
    auVar111 = vmulps_avx512vl(auVar110,auVar101);
    auVar108 = vsubps_avx512vl(auVar108,auVar111);
    auVar108 = vaddps_avx512vl(auVar108,auVar108);
    auVar111 = vmulps_avx512vl(auVar101,auVar101);
    local_8c0 = vsubps_avx512vl(auVar109,auVar111);
    auVar91 = vsubps_avx512vl(local_8c0,auVar91);
    local_8a0 = vmulps_avx512vl(auVar108,auVar108);
    auVar111._8_4_ = 0x40800000;
    auVar111._0_8_ = 0x4080000040800000;
    auVar111._12_4_ = 0x40800000;
    auVar111._16_4_ = 0x40800000;
    auVar111._20_4_ = 0x40800000;
    auVar111._24_4_ = 0x40800000;
    auVar111._28_4_ = 0x40800000;
    auVar109 = vmulps_avx512vl(auVar104,auVar111);
    auVar111 = vmulps_avx512vl(auVar109,auVar91);
    auVar111 = vsubps_avx512vl(local_8a0,auVar111);
    uVar66 = vcmpps_avx512vl(auVar111,auVar112,5);
    bVar51 = (byte)uVar66;
    if (bVar51 != 0) {
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar112 = vaddps_avx512vl(auVar104,auVar104);
      local_8e0 = vrcp14ps_avx512vl(auVar112);
      auVar113 = vfnmadd213ps_avx512vl(local_8e0,auVar112,auVar258);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_8e0,local_8e0);
      auVar258._8_4_ = 0x80000000;
      auVar258._0_8_ = 0x8000000080000000;
      auVar258._12_4_ = 0x80000000;
      auVar258._16_4_ = 0x80000000;
      auVar258._20_4_ = 0x80000000;
      auVar258._24_4_ = 0x80000000;
      auVar258._28_4_ = 0x80000000;
      local_a00 = vxorps_avx512vl(auVar108,auVar258);
      auVar114 = vsubps_avx512vl(local_a00,auVar111);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar111 = vsubps_avx512vl(auVar111,auVar108);
      auVar111 = vmulps_avx512vl(auVar111,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vblendmps_avx512vl(auVar113,auVar114);
      auVar116._0_4_ =
           (uint)(bVar51 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar113._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar65 * auVar115._4_4_ | (uint)!bVar65 * auVar113._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar65 * auVar115._8_4_ | (uint)!bVar65 * auVar113._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar65 * auVar115._12_4_ | (uint)!bVar65 * auVar113._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar65 * auVar115._16_4_ | (uint)!bVar65 * auVar113._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar65 * auVar115._20_4_ | (uint)!bVar65 * auVar113._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar65 * auVar115._24_4_ | (uint)!bVar65 * auVar113._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar116._28_4_ = (uint)bVar65 * auVar115._28_4_ | (uint)!bVar65 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar113,auVar111);
      auVar117._0_4_ =
           (uint)(bVar51 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar113._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar65 * auVar115._4_4_ | (uint)!bVar65 * auVar113._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar65 * auVar115._8_4_ | (uint)!bVar65 * auVar113._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar65 * auVar115._12_4_ | (uint)!bVar65 * auVar113._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar65 * auVar115._16_4_ | (uint)!bVar65 * auVar113._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar65 * auVar115._20_4_ | (uint)!bVar65 * auVar113._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar65 * auVar115._24_4_ | (uint)!bVar65 * auVar113._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar117._28_4_ = (uint)bVar65 * auVar115._28_4_ | (uint)!bVar65 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar113);
      auVar103 = vmaxps_avx512vl(local_5c0,auVar113);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_a20 = vmulps_avx512vl(auVar103,auVar26);
      vandps_avx512vl(auVar104,auVar113);
      uVar56 = vcmpps_avx512vl(local_a20,local_a20,1);
      uVar66 = uVar66 & uVar56;
      bVar53 = (byte)uVar66;
      if (bVar53 != 0) {
        uVar56 = vcmpps_avx512vl(auVar91,_DAT_01faff00,2);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar113 = vblendmps_avx512vl(auVar91,auVar104);
        bVar57 = (byte)uVar56;
        uVar67 = (uint)(bVar57 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar57 & 1) * local_a20._0_4_;
        bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
        uVar60 = (uint)bVar65 * auVar113._4_4_ | (uint)!bVar65 * local_a20._4_4_;
        bVar65 = (bool)((byte)(uVar56 >> 2) & 1);
        uVar55 = (uint)bVar65 * auVar113._8_4_ | (uint)!bVar65 * local_a20._8_4_;
        bVar65 = (bool)((byte)(uVar56 >> 3) & 1);
        uVar138 = (uint)bVar65 * auVar113._12_4_ | (uint)!bVar65 * local_a20._12_4_;
        bVar65 = (bool)((byte)(uVar56 >> 4) & 1);
        uVar139 = (uint)bVar65 * auVar113._16_4_ | (uint)!bVar65 * local_a20._16_4_;
        bVar65 = (bool)((byte)(uVar56 >> 5) & 1);
        uVar140 = (uint)bVar65 * auVar113._20_4_ | (uint)!bVar65 * local_a20._20_4_;
        bVar65 = (bool)((byte)(uVar56 >> 6) & 1);
        uVar141 = (uint)bVar65 * auVar113._24_4_ | (uint)!bVar65 * local_a20._24_4_;
        bVar65 = SUB81(uVar56 >> 7,0);
        uVar142 = (uint)bVar65 * auVar113._28_4_ | (uint)!bVar65 * local_a20._28_4_;
        auVar116._0_4_ = (bVar53 & 1) * uVar67 | !(bool)(bVar53 & 1) * auVar116._0_4_;
        bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar116._4_4_ = bVar65 * uVar60 | !bVar65 * auVar116._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar116._8_4_ = bVar65 * uVar55 | !bVar65 * auVar116._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar116._12_4_ = bVar65 * uVar138 | !bVar65 * auVar116._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar116._16_4_ = bVar65 * uVar139 | !bVar65 * auVar116._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar116._20_4_ = bVar65 * uVar140 | !bVar65 * auVar116._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar116._24_4_ = bVar65 * uVar141 | !bVar65 * auVar116._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar116._28_4_ = bVar65 * uVar142 | !bVar65 * auVar116._28_4_;
        auVar91 = vblendmps_avx512vl(auVar104,auVar91);
        bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar10 = SUB81(uVar56 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar57 & 1) * auVar91._0_4_ | !(bool)(bVar57 & 1) * uVar67) |
             !(bool)(bVar53 & 1) * auVar117._0_4_;
        bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar11 * ((uint)bVar65 * auVar91._4_4_ | !bVar65 * uVar60) |
             !bVar11 * auVar117._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar65 * ((uint)bVar5 * auVar91._8_4_ | !bVar5 * uVar55) |
             !bVar65 * auVar117._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar65 * ((uint)bVar6 * auVar91._12_4_ | !bVar6 * uVar138) |
             !bVar65 * auVar117._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar65 * ((uint)bVar7 * auVar91._16_4_ | !bVar7 * uVar139) |
             !bVar65 * auVar117._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar65 * ((uint)bVar8 * auVar91._20_4_ | !bVar8 * uVar140) |
             !bVar65 * auVar117._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar65 * ((uint)bVar9 * auVar91._24_4_ | !bVar9 * uVar141) |
             !bVar65 * auVar117._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar91._28_4_ | !bVar10 * uVar142) |
             !bVar65 * auVar117._28_4_;
        bVar51 = (~bVar53 | bVar57) & bVar51;
      }
      if ((bVar51 & 0x7f) == 0) {
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar259 = ZEXT3264(auVar80);
      }
      else {
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar100 = vxorps_avx512vl(auVar100,auVar91);
        auVar98 = vxorps_avx512vl(auVar98,auVar91);
        uVar67 = *(uint *)(ray + k * 4 + 0x200);
        auVar99 = vxorps_avx512vl(auVar99,auVar91);
        auVar68 = vsubss_avx512f(ZEXT416(uVar67),ZEXT416((uint)local_930._0_4_));
        auVar104 = vbroadcastss_avx512vl(auVar68);
        auVar104 = vminps_avx512vl(auVar104,auVar117);
        auVar50._4_4_ = fStack_65c;
        auVar50._0_4_ = local_660;
        auVar50._8_4_ = fStack_658;
        auVar50._12_4_ = fStack_654;
        auVar50._16_4_ = fStack_650;
        auVar50._20_4_ = fStack_64c;
        auVar50._24_4_ = fStack_648;
        auVar50._28_4_ = fStack_644;
        auVar113 = vmaxps_avx512vl(auVar50,auVar116);
        auVar107 = vmulps_avx512vl(auVar107,auVar34);
        auVar106 = vfmadd213ps_avx512vl(auVar106,auVar33,auVar107);
        auVar68 = vfmadd213ps_fma(auVar105,auVar32,auVar106);
        auVar105 = vmulps_avx512vl(local_860,auVar34);
        auVar70 = vfmadd231ps_fma(auVar105,local_840,auVar33);
        auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),local_820,auVar32);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar105,auVar106);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar14 = vcmpps_avx512vl(auVar106,auVar107,1);
        auVar115 = vxorps_avx512vl(ZEXT1632(auVar68),auVar91);
        auVar118 = vrcp14ps_avx512vl(auVar105);
        auVar119 = vxorps_avx512vl(auVar105,auVar91);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar121 = vfnmadd213ps_avx512vl(auVar118,auVar105,auVar120);
        auVar68 = vfmadd132ps_fma(auVar121,auVar118,auVar118);
        fVar223 = auVar68._0_4_ * auVar115._0_4_;
        fVar205 = auVar68._4_4_ * auVar115._4_4_;
        auVar37._4_4_ = fVar205;
        auVar37._0_4_ = fVar223;
        fVar218 = auVar68._8_4_ * auVar115._8_4_;
        auVar37._8_4_ = fVar218;
        fVar219 = auVar68._12_4_ * auVar115._12_4_;
        auVar37._12_4_ = fVar219;
        fVar220 = auVar115._16_4_ * 0.0;
        auVar37._16_4_ = fVar220;
        fVar221 = auVar115._20_4_ * 0.0;
        auVar37._20_4_ = fVar221;
        fVar204 = auVar115._24_4_ * 0.0;
        auVar37._24_4_ = fVar204;
        auVar37._28_4_ = auVar115._28_4_;
        uVar15 = vcmpps_avx512vl(auVar105,auVar119,1);
        bVar53 = (byte)uVar14 | (byte)uVar15;
        auVar199._8_4_ = 0xff800000;
        auVar199._0_8_ = 0xff800000ff800000;
        auVar199._12_4_ = 0xff800000;
        auVar199._16_4_ = 0xff800000;
        auVar199._20_4_ = 0xff800000;
        auVar199._24_4_ = 0xff800000;
        auVar199._28_4_ = 0xff800000;
        auVar121 = vblendmps_avx512vl(auVar37,auVar199);
        auVar122._0_4_ =
             (uint)(bVar53 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar118._0_4_;
        bVar65 = (bool)(bVar53 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar65 * auVar121._4_4_ | (uint)!bVar65 * auVar118._4_4_;
        bVar65 = (bool)(bVar53 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar65 * auVar121._8_4_ | (uint)!bVar65 * auVar118._8_4_;
        bVar65 = (bool)(bVar53 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar65 * auVar121._12_4_ | (uint)!bVar65 * auVar118._12_4_;
        bVar65 = (bool)(bVar53 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar65 * auVar121._16_4_ | (uint)!bVar65 * auVar118._16_4_;
        bVar65 = (bool)(bVar53 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar65 * auVar121._20_4_ | (uint)!bVar65 * auVar118._20_4_;
        bVar65 = (bool)(bVar53 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar65 * auVar121._24_4_ | (uint)!bVar65 * auVar118._24_4_;
        auVar122._28_4_ =
             (uint)(bVar53 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar118._28_4_;
        auVar118 = vmaxps_avx512vl(auVar113,auVar122);
        uVar15 = vcmpps_avx512vl(auVar105,auVar119,6);
        bVar53 = (byte)uVar14 | (byte)uVar15;
        auVar123._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar223;
        bVar65 = (bool)(bVar53 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar205;
        bVar65 = (bool)(bVar53 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar218;
        bVar65 = (bool)(bVar53 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar219;
        bVar65 = (bool)(bVar53 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar220;
        bVar65 = (bool)(bVar53 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar221;
        bVar65 = (bool)(bVar53 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar204;
        auVar123._28_4_ =
             (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar115._28_4_;
        auVar104 = vminps_avx512vl(auVar104,auVar123);
        auVar70 = vxorps_avx512vl(auVar113._0_16_,auVar113._0_16_);
        auVar79 = vsubps_avx512vl(ZEXT1632(auVar70),auVar79);
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar70),auVar96);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar70),auVar97);
        auVar97 = vmulps_avx512vl(auVar97,auVar100);
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar96);
        auVar79 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar79);
        auVar96 = vmulps_avx512vl(local_860,auVar100);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_840,auVar99);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_820,auVar98);
        vandps_avx512vl(auVar96,auVar106);
        uVar14 = vcmpps_avx512vl(auVar96,auVar107,1);
        auVar79 = vxorps_avx512vl(auVar79,auVar91);
        auVar97 = vrcp14ps_avx512vl(auVar96);
        auVar91 = vxorps_avx512vl(auVar96,auVar91);
        auVar253 = ZEXT3264(auVar91);
        auVar98 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar120);
        auVar68 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
        fVar223 = auVar68._0_4_ * auVar79._0_4_;
        fVar205 = auVar68._4_4_ * auVar79._4_4_;
        auVar38._4_4_ = fVar205;
        auVar38._0_4_ = fVar223;
        fVar218 = auVar68._8_4_ * auVar79._8_4_;
        auVar38._8_4_ = fVar218;
        fVar219 = auVar68._12_4_ * auVar79._12_4_;
        auVar38._12_4_ = fVar219;
        fVar220 = auVar79._16_4_ * 0.0;
        auVar38._16_4_ = fVar220;
        fVar221 = auVar79._20_4_ * 0.0;
        auVar38._20_4_ = fVar221;
        fVar204 = auVar79._24_4_ * 0.0;
        auVar38._24_4_ = fVar204;
        auVar38._28_4_ = auVar79._28_4_;
        uVar15 = vcmpps_avx512vl(auVar96,auVar91,1);
        bVar53 = (byte)uVar14 | (byte)uVar15;
        auVar98 = vblendmps_avx512vl(auVar38,auVar199);
        auVar124._0_4_ =
             (uint)(bVar53 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar97._0_4_;
        bVar65 = (bool)(bVar53 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar65 * auVar98._4_4_ | (uint)!bVar65 * auVar97._4_4_;
        bVar65 = (bool)(bVar53 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar65 * auVar98._8_4_ | (uint)!bVar65 * auVar97._8_4_;
        bVar65 = (bool)(bVar53 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar65 * auVar98._12_4_ | (uint)!bVar65 * auVar97._12_4_;
        bVar65 = (bool)(bVar53 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar65 * auVar98._16_4_ | (uint)!bVar65 * auVar97._16_4_;
        bVar65 = (bool)(bVar53 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar65 * auVar98._20_4_ | (uint)!bVar65 * auVar97._20_4_;
        bVar65 = (bool)(bVar53 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar65 * auVar98._24_4_ | (uint)!bVar65 * auVar97._24_4_;
        auVar124._28_4_ =
             (uint)(bVar53 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar97._28_4_;
        auVar252 = ZEXT3264(auVar124);
        _local_a40 = vmaxps_avx(auVar118,auVar124);
        auVar246 = ZEXT3264(_local_a40);
        uVar15 = vcmpps_avx512vl(auVar96,auVar91,6);
        bVar53 = (byte)uVar14 | (byte)uVar15;
        auVar125._0_4_ = (uint)(bVar53 & 1) * 0x7f800000 | (uint)!(bool)(bVar53 & 1) * (int)fVar223;
        bVar65 = (bool)(bVar53 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar205;
        bVar65 = (bool)(bVar53 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar218;
        bVar65 = (bool)(bVar53 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar219;
        bVar65 = (bool)(bVar53 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar220;
        bVar65 = (bool)(bVar53 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar221;
        bVar65 = (bool)(bVar53 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar204;
        auVar125._28_4_ =
             (uint)(bVar53 >> 7) * 0x7f800000 | (uint)!(bool)(bVar53 >> 7) * auVar79._28_4_;
        local_6e0 = vminps_avx(auVar104,auVar125);
        uVar14 = vcmpps_avx512vl(_local_a40,local_6e0,2);
        bVar51 = bVar51 & 0x7f & (byte)uVar14;
        if (bVar51 == 0) {
          auVar259 = ZEXT3264(auVar120);
        }
        else {
          auVar91 = vmaxps_avx512vl(ZEXT1632(auVar70),auVar80);
          auVar80 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar101);
          auVar80 = vmulps_avx512vl(auVar95,auVar80);
          auVar79 = vfmadd213ps_avx512vl(auVar111,auVar110,auVar101);
          auVar39._4_4_ = auVar95._4_4_ * auVar79._4_4_;
          auVar39._0_4_ = auVar95._0_4_ * auVar79._0_4_;
          auVar39._8_4_ = auVar95._8_4_ * auVar79._8_4_;
          auVar39._12_4_ = auVar95._12_4_ * auVar79._12_4_;
          auVar39._16_4_ = auVar95._16_4_ * auVar79._16_4_;
          auVar39._20_4_ = auVar95._20_4_ * auVar79._20_4_;
          auVar39._24_4_ = auVar95._24_4_ * auVar79._24_4_;
          auVar39._28_4_ = auVar124._28_4_;
          auVar80 = vminps_avx512vl(auVar80,auVar120);
          auVar79 = ZEXT832(0) << 0x20;
          auVar80 = vmaxps_avx(auVar80,ZEXT832(0) << 0x20);
          auVar96 = vminps_avx512vl(auVar39,auVar120);
          auVar40._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
          auVar40._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
          auVar40._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
          auVar40._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
          auVar40._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
          auVar40._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
          auVar40._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
          auVar40._28_4_ = auVar80._28_4_ + 7.0;
          auVar68 = vfmadd213ps_fma(auVar40,auVar153,auVar226);
          local_520 = ZEXT1632(auVar68);
          auVar80 = vmaxps_avx(auVar96,ZEXT832(0) << 0x20);
          auVar41._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
          auVar41._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
          auVar41._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
          auVar41._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
          auVar41._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
          auVar41._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
          auVar41._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
          auVar41._28_4_ = auVar80._28_4_ + 7.0;
          auVar68 = vfmadd213ps_fma(auVar41,auVar153,auVar226);
          local_540 = ZEXT1632(auVar68);
          auVar42._4_4_ = auVar91._4_4_ * auVar91._4_4_;
          auVar42._0_4_ = auVar91._0_4_ * auVar91._0_4_;
          auVar42._8_4_ = auVar91._8_4_ * auVar91._8_4_;
          auVar42._12_4_ = auVar91._12_4_ * auVar91._12_4_;
          auVar42._16_4_ = auVar91._16_4_ * auVar91._16_4_;
          auVar42._20_4_ = auVar91._20_4_ * auVar91._20_4_;
          auVar42._24_4_ = auVar91._24_4_ * auVar91._24_4_;
          auVar42._28_4_ = auVar91._28_4_;
          auVar80 = vsubps_avx(local_8c0,auVar42);
          local_ae0 = auVar109._0_4_;
          fStack_adc = auVar109._4_4_;
          fStack_ad8 = auVar109._8_4_;
          fStack_ad4 = auVar109._12_4_;
          fStack_ad0 = auVar109._16_4_;
          fStack_acc = auVar109._20_4_;
          fStack_ac8 = auVar109._24_4_;
          auVar43._4_4_ = auVar80._4_4_ * fStack_adc;
          auVar43._0_4_ = auVar80._0_4_ * local_ae0;
          auVar43._8_4_ = auVar80._8_4_ * fStack_ad8;
          auVar43._12_4_ = auVar80._12_4_ * fStack_ad4;
          auVar43._16_4_ = auVar80._16_4_ * fStack_ad0;
          auVar43._20_4_ = auVar80._20_4_ * fStack_acc;
          auVar43._24_4_ = auVar80._24_4_ * fStack_ac8;
          auVar43._28_4_ = auVar91._28_4_;
          auVar91 = vsubps_avx(local_8a0,auVar43);
          uVar14 = vcmpps_avx512vl(auVar91,ZEXT832(0) << 0x20,5);
          bVar53 = (byte)uVar14;
          auVar259 = ZEXT3264(auVar120);
          if (bVar53 == 0) {
            bVar53 = 0;
            auVar92 = ZEXT832(0) << 0x20;
            auVar160 = ZEXT864(0) << 0x20;
            auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar252 = ZEXT864(0) << 0x20;
            auVar126._8_4_ = 0x7f800000;
            auVar126._0_8_ = 0x7f8000007f800000;
            auVar126._12_4_ = 0x7f800000;
            auVar126._16_4_ = 0x7f800000;
            auVar126._20_4_ = 0x7f800000;
            auVar126._24_4_ = 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar127._8_4_ = 0xff800000;
            auVar127._0_8_ = 0xff800000ff800000;
            auVar127._12_4_ = 0xff800000;
            auVar127._16_4_ = 0xff800000;
            auVar127._20_4_ = 0xff800000;
            auVar127._24_4_ = 0xff800000;
            auVar127._28_4_ = 0xff800000;
          }
          else {
            uVar66 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar70),5);
            auVar91 = vsqrtps_avx(auVar91);
            auVar79 = vfnmadd213ps_avx512vl(auVar112,local_8e0,auVar120);
            auVar97 = vfmadd132ps_avx512vl(auVar79,local_8e0,local_8e0);
            auVar79 = vsubps_avx(local_a00,auVar91);
            auVar98 = vmulps_avx512vl(auVar79,auVar97);
            auVar91 = vsubps_avx512vl(auVar91,auVar108);
            auVar97 = vmulps_avx512vl(auVar91,auVar97);
            auVar91 = vfmadd213ps_avx512vl(auVar110,auVar98,auVar101);
            auVar44._4_4_ = auVar95._4_4_ * auVar91._4_4_;
            auVar44._0_4_ = auVar95._0_4_ * auVar91._0_4_;
            auVar44._8_4_ = auVar95._8_4_ * auVar91._8_4_;
            auVar44._12_4_ = auVar95._12_4_ * auVar91._12_4_;
            auVar44._16_4_ = auVar95._16_4_ * auVar91._16_4_;
            auVar44._20_4_ = auVar95._20_4_ * auVar91._20_4_;
            auVar44._24_4_ = auVar95._24_4_ * auVar91._24_4_;
            auVar44._28_4_ = auVar96._28_4_;
            auVar91 = vmulps_avx512vl(local_820,auVar98);
            auVar79 = vmulps_avx512vl(local_840,auVar98);
            auVar99 = vmulps_avx512vl(local_860,auVar98);
            auVar96 = vfmadd213ps_avx512vl(auVar102,auVar44,local_880);
            auVar91 = vsubps_avx512vl(auVar91,auVar96);
            auVar96 = vfmadd213ps_avx512vl(auVar92,auVar44,auVar93);
            auVar96 = vsubps_avx512vl(auVar79,auVar96);
            auVar68 = vfmadd213ps_fma(auVar44,auVar78,auVar94);
            auVar79 = vsubps_avx(auVar99,ZEXT1632(auVar68));
            auVar252 = ZEXT3264(auVar79);
            auVar79 = vfmadd213ps_avx512vl(auVar110,auVar97,auVar101);
            auVar95 = vmulps_avx512vl(auVar95,auVar79);
            auVar79 = vmulps_avx512vl(local_820,auVar97);
            auVar99 = vmulps_avx512vl(local_840,auVar97);
            auVar100 = vmulps_avx512vl(local_860,auVar97);
            auVar68 = vfmadd213ps_fma(auVar102,auVar95,local_880);
            auVar79 = vsubps_avx(auVar79,ZEXT1632(auVar68));
            auVar68 = vfmadd213ps_fma(auVar92,auVar95,auVar93);
            auVar92 = vsubps_avx512vl(auVar99,ZEXT1632(auVar68));
            auVar68 = vfmadd213ps_fma(auVar78,auVar95,auVar94);
            auVar78 = vsubps_avx512vl(auVar100,ZEXT1632(auVar68));
            auVar160 = ZEXT3264(auVar78);
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar78 = vblendmps_avx512vl(auVar154,auVar98);
            bVar65 = (bool)((byte)uVar66 & 1);
            auVar126._0_4_ = (uint)bVar65 * auVar78._0_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar65 * auVar78._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar65 * auVar78._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar65 * auVar78._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar126._16_4_ = (uint)bVar65 * auVar78._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar126._20_4_ = (uint)bVar65 * auVar78._20_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar126._24_4_ = (uint)bVar65 * auVar78._24_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar126._28_4_ = (uint)bVar65 * auVar78._28_4_ | (uint)!bVar65 * 0x7f800000;
            auVar200._8_4_ = 0xff800000;
            auVar200._0_8_ = 0xff800000ff800000;
            auVar200._12_4_ = 0xff800000;
            auVar200._16_4_ = 0xff800000;
            auVar200._20_4_ = 0xff800000;
            auVar200._24_4_ = 0xff800000;
            auVar200._28_4_ = 0xff800000;
            auVar78 = vblendmps_avx512vl(auVar200,auVar97);
            bVar65 = (bool)((byte)uVar66 & 1);
            auVar127._0_4_ = (uint)bVar65 * auVar78._0_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar127._4_4_ = (uint)bVar65 * auVar78._4_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar127._8_4_ = (uint)bVar65 * auVar78._8_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar127._12_4_ = (uint)bVar65 * auVar78._12_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar127._16_4_ = (uint)bVar65 * auVar78._16_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar127._20_4_ = (uint)bVar65 * auVar78._20_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar127._24_4_ = (uint)bVar65 * auVar78._24_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar127._28_4_ = (uint)bVar65 * auVar78._28_4_ | (uint)!bVar65 * -0x800000;
            auVar27._8_4_ = 0x36000000;
            auVar27._0_8_ = 0x3600000036000000;
            auVar27._12_4_ = 0x36000000;
            auVar27._16_4_ = 0x36000000;
            auVar27._20_4_ = 0x36000000;
            auVar27._24_4_ = 0x36000000;
            auVar27._28_4_ = 0x36000000;
            auVar78 = vmulps_avx512vl(auVar103,auVar27);
            uVar56 = vcmpps_avx512vl(auVar78,local_a20,0xe);
            uVar66 = uVar66 & uVar56;
            bVar57 = (byte)uVar66;
            if (bVar57 != 0) {
              uVar56 = vcmpps_avx512vl(auVar80,ZEXT1632(ZEXT816(0) << 0x40),2);
              auVar240._8_4_ = 0x7f800000;
              auVar240._0_8_ = 0x7f8000007f800000;
              auVar240._12_4_ = 0x7f800000;
              auVar240._16_4_ = 0x7f800000;
              auVar240._20_4_ = 0x7f800000;
              auVar240._24_4_ = 0x7f800000;
              auVar240._28_4_ = 0x7f800000;
              auVar245._8_4_ = 0xff800000;
              auVar245._0_8_ = 0xff800000ff800000;
              auVar245._12_4_ = 0xff800000;
              auVar245._16_4_ = 0xff800000;
              auVar245._20_4_ = 0xff800000;
              auVar245._24_4_ = 0xff800000;
              auVar245._28_4_ = 0xff800000;
              auVar80 = vblendmps_avx512vl(auVar240,auVar245);
              bVar63 = (byte)uVar56;
              uVar60 = (uint)(bVar63 & 1) * auVar80._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar78._0_4_;
              bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
              uVar55 = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * auVar78._4_4_;
              bVar65 = (bool)((byte)(uVar56 >> 2) & 1);
              uVar138 = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * auVar78._8_4_;
              bVar65 = (bool)((byte)(uVar56 >> 3) & 1);
              uVar139 = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * auVar78._12_4_;
              bVar65 = (bool)((byte)(uVar56 >> 4) & 1);
              uVar140 = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * auVar78._16_4_;
              bVar65 = (bool)((byte)(uVar56 >> 5) & 1);
              uVar141 = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * auVar78._20_4_;
              bVar65 = (bool)((byte)(uVar56 >> 6) & 1);
              uVar142 = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * auVar78._24_4_;
              bVar65 = SUB81(uVar56 >> 7,0);
              uVar143 = (uint)bVar65 * auVar80._28_4_ | (uint)!bVar65 * auVar78._28_4_;
              auVar126._0_4_ = (bVar57 & 1) * uVar60 | !(bool)(bVar57 & 1) * auVar126._0_4_;
              bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar126._4_4_ = bVar65 * uVar55 | !bVar65 * auVar126._4_4_;
              bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar126._8_4_ = bVar65 * uVar138 | !bVar65 * auVar126._8_4_;
              bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar126._12_4_ = bVar65 * uVar139 | !bVar65 * auVar126._12_4_;
              bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar126._16_4_ = bVar65 * uVar140 | !bVar65 * auVar126._16_4_;
              bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar126._20_4_ = bVar65 * uVar141 | !bVar65 * auVar126._20_4_;
              bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar126._24_4_ = bVar65 * uVar142 | !bVar65 * auVar126._24_4_;
              bVar65 = SUB81(uVar66 >> 7,0);
              auVar126._28_4_ = bVar65 * uVar143 | !bVar65 * auVar126._28_4_;
              auVar80 = vblendmps_avx512vl(auVar245,auVar240);
              bVar65 = (bool)((byte)(uVar56 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar56 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar56 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar56 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar56 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar56 >> 6) & 1);
              bVar10 = SUB81(uVar56 >> 7,0);
              auVar127._0_4_ =
                   (uint)(bVar57 & 1) *
                   ((uint)(bVar63 & 1) * auVar80._0_4_ | !(bool)(bVar63 & 1) * uVar60) |
                   !(bool)(bVar57 & 1) * auVar127._0_4_;
              bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar127._4_4_ =
                   (uint)bVar11 * ((uint)bVar65 * auVar80._4_4_ | !bVar65 * uVar55) |
                   !bVar11 * auVar127._4_4_;
              bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar127._8_4_ =
                   (uint)bVar65 * ((uint)bVar5 * auVar80._8_4_ | !bVar5 * uVar138) |
                   !bVar65 * auVar127._8_4_;
              bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar127._12_4_ =
                   (uint)bVar65 * ((uint)bVar6 * auVar80._12_4_ | !bVar6 * uVar139) |
                   !bVar65 * auVar127._12_4_;
              bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar127._16_4_ =
                   (uint)bVar65 * ((uint)bVar7 * auVar80._16_4_ | !bVar7 * uVar140) |
                   !bVar65 * auVar127._16_4_;
              bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar127._20_4_ =
                   (uint)bVar65 * ((uint)bVar8 * auVar80._20_4_ | !bVar8 * uVar141) |
                   !bVar65 * auVar127._20_4_;
              bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar127._24_4_ =
                   (uint)bVar65 * ((uint)bVar9 * auVar80._24_4_ | !bVar9 * uVar142) |
                   !bVar65 * auVar127._24_4_;
              bVar65 = SUB81(uVar66 >> 7,0);
              auVar127._28_4_ =
                   (uint)bVar65 * ((uint)bVar10 * auVar80._28_4_ | !bVar10 * uVar143) |
                   !bVar65 * auVar127._28_4_;
              bVar53 = (~bVar57 | bVar63) & bVar53;
            }
          }
          auVar253._0_4_ = local_860._0_4_ * auVar160._0_4_;
          auVar253._4_4_ = local_860._4_4_ * auVar160._4_4_;
          auVar253._8_4_ = local_860._8_4_ * auVar160._8_4_;
          auVar253._12_4_ = local_860._12_4_ * auVar160._12_4_;
          auVar253._16_4_ = local_860._16_4_ * auVar160._16_4_;
          auVar253._20_4_ = local_860._20_4_ * auVar160._20_4_;
          auVar253._28_36_ = auVar160._28_36_;
          auVar253._24_4_ = local_860._24_4_ * auVar160._24_4_;
          auVar246 = ZEXT3264(local_840);
          auVar68 = vfmadd231ps_fma(auVar253._0_32_,local_840,auVar92);
          auVar241 = ZEXT3264(local_820);
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),local_820,auVar79);
          auVar233._8_4_ = 0x7fffffff;
          auVar233._0_8_ = 0x7fffffff7fffffff;
          auVar233._12_4_ = 0x7fffffff;
          auVar233._16_4_ = 0x7fffffff;
          auVar233._20_4_ = 0x7fffffff;
          auVar233._24_4_ = 0x7fffffff;
          auVar233._28_4_ = 0x7fffffff;
          auVar80 = vandps_avx(ZEXT1632(auVar68),auVar233);
          auVar253 = ZEXT3264(_local_a40);
          _local_440 = _local_a40;
          auVar231._8_4_ = 0x3e99999a;
          auVar231._0_8_ = 0x3e99999a3e99999a;
          auVar231._12_4_ = 0x3e99999a;
          auVar231._16_4_ = 0x3e99999a;
          auVar231._20_4_ = 0x3e99999a;
          auVar231._24_4_ = 0x3e99999a;
          auVar231._28_4_ = 0x3e99999a;
          uVar14 = vcmpps_avx512vl(auVar80,auVar231,1);
          local_780._0_2_ = (short)uVar14;
          local_700 = vmaxps_avx(_local_a40,auVar127);
          auVar80 = vminps_avx(local_6e0,auVar126);
          uVar14 = vcmpps_avx512vl(_local_a40,auVar80,2);
          bVar57 = (byte)uVar14 & bVar51;
          uVar15 = vcmpps_avx512vl(local_700,local_6e0,2);
          if ((bVar51 & ((byte)uVar15 | (byte)uVar14)) != 0) {
            auVar45._4_4_ = local_860._4_4_ * auVar252._4_4_;
            auVar45._0_4_ = local_860._0_4_ * auVar252._0_4_;
            auVar45._8_4_ = local_860._8_4_ * auVar252._8_4_;
            auVar45._12_4_ = local_860._12_4_ * auVar252._12_4_;
            auVar45._16_4_ = local_860._16_4_ * auVar252._16_4_;
            auVar45._20_4_ = local_860._20_4_ * auVar252._20_4_;
            auVar45._24_4_ = local_860._24_4_ * auVar252._24_4_;
            auVar45._28_4_ = auVar80._28_4_;
            auVar68 = vfmadd213ps_fma(auVar96,local_840,auVar45);
            auVar68 = vfmadd213ps_fma(auVar91,local_820,ZEXT1632(auVar68));
            auVar80 = vandps_avx(ZEXT1632(auVar68),auVar233);
            uVar14 = vcmpps_avx512vl(auVar80,auVar231,1);
            bVar63 = (byte)uVar14 | ~bVar53;
            auVar156._8_4_ = 2;
            auVar156._0_8_ = 0x200000002;
            auVar156._12_4_ = 2;
            auVar156._16_4_ = 2;
            auVar156._20_4_ = 2;
            auVar156._24_4_ = 2;
            auVar156._28_4_ = 2;
            auVar28._8_4_ = 3;
            auVar28._0_8_ = 0x300000003;
            auVar28._12_4_ = 3;
            auVar28._16_4_ = 3;
            auVar28._20_4_ = 3;
            auVar28._24_4_ = 3;
            auVar28._28_4_ = 3;
            auVar80 = vpblendmd_avx512vl(auVar156,auVar28);
            local_6a0._0_4_ = (uint)(bVar63 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
            bVar65 = (bool)(bVar63 >> 1 & 1);
            local_6a0._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar63 >> 2 & 1);
            local_6a0._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar63 >> 3 & 1);
            local_6a0._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar63 >> 4 & 1);
            local_6a0._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar63 >> 5 & 1);
            local_6a0._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar63 >> 6 & 1);
            local_6a0._24_4_ = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * 2;
            local_6a0._28_4_ = (uint)(bVar63 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2
            ;
            local_720 = vpbroadcastd_avx512vl();
            uVar14 = vpcmpd_avx512vl(local_720,local_6a0,5);
            bVar63 = (byte)uVar14 & bVar57;
            if (bVar63 == 0) {
              auVar158._4_4_ = uVar67;
              auVar158._0_4_ = uVar67;
              auVar158._8_4_ = uVar67;
              auVar158._12_4_ = uVar67;
              auVar158._16_4_ = uVar67;
              auVar158._20_4_ = uVar67;
              auVar158._24_4_ = uVar67;
              auVar158._28_4_ = uVar67;
              auVar80 = local_700;
            }
            else {
              local_6c0 = local_700;
              auVar70 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar68 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar1 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar69 = vminps_avx(auVar70,auVar1);
              auVar70 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar1 = vmaxps_avx(auVar68,auVar70);
              auVar180._8_4_ = 0x7fffffff;
              auVar180._0_8_ = 0x7fffffff7fffffff;
              auVar180._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx(auVar69,auVar180);
              auVar70 = vandps_avx(auVar1,auVar180);
              auVar68 = vmaxps_avx(auVar68,auVar70);
              auVar70 = vmovshdup_avx(auVar68);
              auVar70 = vmaxss_avx(auVar70,auVar68);
              auVar68 = vshufpd_avx(auVar68,auVar68,1);
              auVar68 = vmaxss_avx(auVar68,auVar70);
              fVar223 = auVar68._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar1,auVar1,0xff);
              local_760 = (float)local_a40._0_4_ + fVar161;
              fStack_75c = (float)local_a40._4_4_ + fVar161;
              fStack_758 = fStack_a38 + fVar161;
              fStack_754 = fStack_a34 + fVar161;
              fStack_750 = fStack_a30 + fVar161;
              fStack_74c = fStack_a2c + fVar161;
              fStack_748 = fStack_a28 + fVar161;
              fStack_744 = fStack_a24 + fVar161;
              do {
                auVar157._8_4_ = 0x7f800000;
                auVar157._0_8_ = 0x7f8000007f800000;
                auVar157._12_4_ = 0x7f800000;
                auVar157._16_4_ = 0x7f800000;
                auVar157._20_4_ = 0x7f800000;
                auVar157._24_4_ = 0x7f800000;
                auVar157._28_4_ = 0x7f800000;
                auVar80 = vblendmps_avx512vl(auVar157,_local_a40);
                auVar129._0_4_ =
                     (uint)(bVar63 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
                bVar65 = (bool)(bVar63 >> 1 & 1);
                auVar129._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar63 >> 2 & 1);
                auVar129._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar63 >> 3 & 1);
                auVar129._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar63 >> 4 & 1);
                auVar129._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar63 >> 5 & 1);
                auVar129._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 0x7f800000;
                auVar129._24_4_ =
                     (uint)(bVar63 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar63 >> 6) * 0x7f800000;
                auVar129._28_4_ = 0x7f800000;
                auVar80 = vshufps_avx(auVar129,auVar129,0xb1);
                auVar80 = vminps_avx(auVar129,auVar80);
                auVar91 = vshufpd_avx(auVar80,auVar80,5);
                auVar80 = vminps_avx(auVar80,auVar91);
                auVar91 = vpermpd_avx2(auVar80,0x4e);
                auVar80 = vminps_avx(auVar80,auVar91);
                uVar14 = vcmpps_avx512vl(auVar129,auVar80,0);
                bVar52 = (byte)uVar14 & bVar63;
                bVar54 = bVar63;
                if (bVar52 != 0) {
                  bVar54 = bVar52;
                }
                iVar17 = 0;
                for (uVar67 = (uint)bVar54; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
                  iVar17 = iVar17 + 1;
                }
                uVar67 = *(uint *)(local_520 + (uint)(iVar17 << 2));
                uVar60 = *(uint *)(local_440 + (uint)(iVar17 << 2));
                fVar205 = auVar13._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_9e0._0_4_);
                }
                auVar68 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar67),0x10);
                auVar160 = ZEXT1664(auVar68);
                bVar65 = true;
                uVar66 = 0;
                do {
                  uVar162 = auVar160._0_4_;
                  auVar145._4_4_ = uVar162;
                  auVar145._0_4_ = uVar162;
                  auVar145._8_4_ = uVar162;
                  auVar145._12_4_ = uVar162;
                  auVar68 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_9d0);
                  auVar70 = vmovshdup_avx(auVar160._0_16_);
                  fVar234 = auVar70._0_4_;
                  fVar222 = 1.0 - fVar234;
                  fVar218 = fVar234 * fVar234;
                  auVar72 = SUB6416(ZEXT464(0x40400000),0);
                  auVar71 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar69 = vfmadd213ss_fma(auVar72,auVar70,auVar71);
                  auVar1 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar218),
                                           SUB6416(ZEXT464(0x40000000),0));
                  auVar77 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar222),auVar71);
                  auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar222 * fVar222)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar219 = fVar222 * fVar222 * -fVar234 * 0.5;
                  fVar220 = auVar1._0_4_ * 0.5;
                  fVar221 = auVar77._0_4_ * 0.5;
                  fVar204 = fVar234 * fVar234 * -fVar222 * 0.5;
                  auVar206._0_4_ = fVar204 * (float)local_9c0._0_4_;
                  auVar206._4_4_ = fVar204 * (float)local_9c0._4_4_;
                  auVar206._8_4_ = fVar204 * fStack_9b8;
                  auVar206._12_4_ = fVar204 * fStack_9b4;
                  auVar224._4_4_ = fVar221;
                  auVar224._0_4_ = fVar221;
                  auVar224._8_4_ = fVar221;
                  auVar224._12_4_ = fVar221;
                  auVar1 = vfmadd132ps_fma(auVar224,auVar206,local_980._0_16_);
                  auVar181._4_4_ = fVar220;
                  auVar181._0_4_ = fVar220;
                  auVar181._8_4_ = fVar220;
                  auVar181._12_4_ = fVar220;
                  auVar1 = vfmadd132ps_fma(auVar181,auVar1,local_9a0._0_16_);
                  auVar207._4_4_ = fVar219;
                  auVar207._0_4_ = fVar219;
                  auVar207._8_4_ = fVar219;
                  auVar207._12_4_ = fVar219;
                  auVar1 = vfmadd132ps_fma(auVar207,auVar1,local_960._0_16_);
                  auVar77 = vfmadd231ss_fma(auVar71,auVar70,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar77;
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar70,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar77;
                  auVar77 = vfmadd213ss_fma(auVar72,auVar70,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar77;
                  local_880._0_16_ = auVar1;
                  auVar1 = vsubps_avx(auVar68,auVar1);
                  auVar68 = vdpps_avx(auVar1,auVar1,0x7f);
                  fVar219 = auVar68._0_4_;
                  local_800 = auVar160;
                  if (fVar219 < 0.0) {
                    local_a00._0_4_ = fVar218;
                    local_a20._0_4_ = fVar222 * -2.0;
                    auVar259._0_4_ = sqrtf(fVar219);
                    auVar259._4_60_ = extraout_var;
                    auVar69 = ZEXT416(auVar69._0_4_);
                    auVar77 = auVar259._0_16_;
                  }
                  else {
                    auVar77 = vsqrtss_avx(auVar68,auVar68);
                    local_a20._0_4_ = fVar222 * -2.0;
                    local_a00._0_4_ = fVar218;
                  }
                  auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar234 * (fVar222 + fVar222))),
                                             ZEXT416((uint)fVar222),ZEXT416((uint)fVar222));
                  auVar69 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar234 + fVar234)),
                                            ZEXT416((uint)(fVar234 * fVar234 * 3.0)));
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar70,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar222 * -3.0)),
                                            ZEXT416((uint)(fVar222 + fVar222)),auVar71);
                  auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar70,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar218 = auVar73._0_4_ * 0.5;
                  fVar220 = auVar69._0_4_ * 0.5;
                  fVar221 = auVar72._0_4_ * 0.5;
                  fVar204 = auVar71._0_4_ * 0.5;
                  auVar208._0_4_ = fVar204 * (float)local_9c0._0_4_;
                  auVar208._4_4_ = fVar204 * (float)local_9c0._4_4_;
                  auVar208._8_4_ = fVar204 * fStack_9b8;
                  auVar208._12_4_ = fVar204 * fStack_9b4;
                  auVar182._4_4_ = fVar221;
                  auVar182._0_4_ = fVar221;
                  auVar182._8_4_ = fVar221;
                  auVar182._12_4_ = fVar221;
                  auVar69 = vfmadd132ps_fma(auVar182,auVar208,local_980._0_16_);
                  auVar164._4_4_ = fVar220;
                  auVar164._0_4_ = fVar220;
                  auVar164._8_4_ = fVar220;
                  auVar164._12_4_ = fVar220;
                  auVar69 = vfmadd132ps_fma(auVar164,auVar69,local_9a0._0_16_);
                  auVar255._4_4_ = fVar218;
                  auVar255._0_4_ = fVar218;
                  auVar255._8_4_ = fVar218;
                  auVar255._12_4_ = fVar218;
                  auVar69 = vfmadd132ps_fma(auVar255,auVar69,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar69,auVar69,0x7f);
                  auVar46._12_4_ = 0;
                  auVar46._0_12_ = ZEXT812(0);
                  fVar218 = local_a00._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar218));
                  fVar220 = auVar71._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar218));
                  auVar18._8_4_ = 0x80000000;
                  auVar18._0_8_ = 0x8000000080000000;
                  auVar18._12_4_ = 0x80000000;
                  auVar72 = vxorps_avx512vl(local_a00._0_16_,auVar18);
                  auVar71 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar67 = auVar77._0_4_;
                  if (fVar218 < auVar72._0_4_) {
                    fVar221 = sqrtf(fVar218);
                    auVar77 = ZEXT416(uVar67);
                  }
                  else {
                    auVar72 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar221 = auVar72._0_4_;
                  }
                  fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
                  auVar146._0_4_ = auVar69._0_4_ * fVar218;
                  auVar146._4_4_ = auVar69._4_4_ * fVar218;
                  auVar146._8_4_ = auVar69._8_4_ * fVar218;
                  auVar146._12_4_ = auVar69._12_4_ * fVar218;
                  auVar72 = vdpps_avx(auVar1,auVar146,0x7f);
                  fVar222 = auVar77._0_4_;
                  fVar220 = auVar72._0_4_;
                  auVar147._0_4_ = fVar220 * fVar220;
                  auVar147._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                  auVar147._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                  auVar147._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                  auVar73 = vsubps_avx512vl(auVar68,auVar147);
                  fVar204 = auVar73._0_4_;
                  auVar165._4_12_ = ZEXT812(0) << 0x20;
                  auVar165._0_4_ = fVar204;
                  auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
                  auVar75 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
                  if (fVar204 < 0.0) {
                    local_910 = fVar218;
                    fStack_90c = fVar218;
                    fStack_908 = fVar218;
                    fStack_904 = fVar218;
                    local_900 = auVar74;
                    fVar204 = sqrtf(fVar204);
                    auVar75 = ZEXT416(auVar75._0_4_);
                    auVar77 = ZEXT416(uVar67);
                    auVar73 = local_900;
                    fVar218 = local_910;
                    fVar234 = fStack_90c;
                    fVar235 = fStack_908;
                    fVar236 = fStack_904;
                  }
                  else {
                    auVar73 = vsqrtss_avx(auVar73,auVar73);
                    fVar204 = auVar73._0_4_;
                    auVar73 = auVar74;
                    fVar234 = fVar218;
                    fVar235 = fVar218;
                    fVar236 = fVar218;
                  }
                  auVar252 = ZEXT1664(auVar1);
                  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar259 = ZEXT3264(auVar80);
                  auVar166._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar166._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar166._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar166._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar183._4_4_ = local_8c0._0_4_;
                  auVar183._0_4_ = local_8c0._0_4_;
                  auVar183._8_4_ = local_8c0._0_4_;
                  auVar183._12_4_ = local_8c0._0_4_;
                  auVar232 = vfmadd132ps_fma(auVar183,auVar166,local_980._0_16_);
                  auVar167._4_4_ = local_8a0._0_4_;
                  auVar167._0_4_ = local_8a0._0_4_;
                  auVar167._8_4_ = local_8a0._0_4_;
                  auVar167._12_4_ = local_8a0._0_4_;
                  auVar232 = vfmadd132ps_fma(auVar167,auVar232,local_9a0._0_16_);
                  auVar70 = vfmadd213ss_fma(auVar70,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar70._0_4_;
                  auVar184._4_4_ = uVar162;
                  auVar184._0_4_ = uVar162;
                  auVar184._8_4_ = uVar162;
                  auVar184._12_4_ = uVar162;
                  auVar70 = vfmadd132ps_fma(auVar184,auVar232,local_960._0_16_);
                  auVar168._0_4_ = auVar70._0_4_ * (float)local_a00._0_4_;
                  auVar168._4_4_ = auVar70._4_4_ * (float)local_a00._0_4_;
                  auVar168._8_4_ = auVar70._8_4_ * (float)local_a00._0_4_;
                  auVar168._12_4_ = auVar70._12_4_ * (float)local_a00._0_4_;
                  auVar70 = vdpps_avx(auVar69,auVar70,0x7f);
                  fVar179 = auVar70._0_4_;
                  auVar185._0_4_ = auVar69._0_4_ * fVar179;
                  auVar185._4_4_ = auVar69._4_4_ * fVar179;
                  auVar185._8_4_ = auVar69._8_4_ * fVar179;
                  auVar185._12_4_ = auVar69._12_4_ * fVar179;
                  auVar70 = vsubps_avx(auVar168,auVar185);
                  fVar179 = auVar71._0_4_ * (float)local_a20._0_4_;
                  auVar232 = vmaxss_avx(ZEXT416((uint)fVar223),
                                        ZEXT416((uint)(local_800._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar250._16_48_ = local_800._16_48_;
                  auVar76 = vxorps_avx512vl(auVar69,auVar19);
                  auVar186._0_4_ = fVar218 * auVar70._0_4_ * fVar179;
                  auVar186._4_4_ = fVar234 * auVar70._4_4_ * fVar179;
                  auVar186._8_4_ = fVar235 * auVar70._8_4_ * fVar179;
                  auVar186._12_4_ = fVar236 * auVar70._12_4_ * fVar179;
                  auVar253 = ZEXT1664(auVar146);
                  auVar70 = vdpps_avx(auVar76,auVar146,0x7f);
                  auVar71 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar223),auVar232);
                  auVar77 = vdpps_avx(auVar1,auVar186,0x7f);
                  auVar254 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                             ZEXT416((uint)(fVar223 / fVar221)),auVar71);
                  fVar218 = auVar70._0_4_ + auVar77._0_4_;
                  auVar70 = vdpps_avx(local_9d0,auVar146,0x7f);
                  auVar77 = vdpps_avx(auVar1,auVar76,0x7f);
                  auVar71 = vmulss_avx512f(auVar75,auVar73);
                  fVar221 = auVar74._0_4_ * 1.5 + auVar71._0_4_ * auVar73._0_4_ * auVar73._0_4_;
                  auVar71 = vdpps_avx(auVar1,local_9d0,0x7f);
                  auVar74 = vfnmadd231ss_fma(auVar77,auVar72,ZEXT416((uint)fVar218));
                  auVar71 = vfnmadd231ss_fma(auVar71,auVar72,auVar70);
                  auVar77 = vpermilps_avx(local_880._0_16_,0xff);
                  fVar204 = fVar204 - auVar77._0_4_;
                  auVar73 = vshufps_avx(auVar69,auVar69,0xff);
                  auVar77 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar221),auVar73);
                  auVar243._8_4_ = 0x80000000;
                  auVar243._0_8_ = 0x8000000080000000;
                  auVar243._12_4_ = 0x80000000;
                  auVar246 = ZEXT1664(auVar243);
                  auVar238._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                  auVar238._8_4_ = auVar77._8_4_ ^ 0x80000000;
                  auVar238._12_4_ = auVar77._12_4_ ^ 0x80000000;
                  auVar241 = ZEXT1664(auVar238);
                  auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar221));
                  auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar77._0_4_)),
                                            ZEXT416((uint)fVar218),auVar71);
                  auVar77 = vinsertps_avx(auVar238,auVar71,0x1c);
                  auVar229._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
                  auVar229._8_4_ = auVar70._8_4_ ^ 0x80000000;
                  auVar229._12_4_ = auVar70._12_4_ ^ 0x80000000;
                  auVar71 = vinsertps_avx(ZEXT416((uint)fVar218),auVar229,0x10);
                  auVar209._0_4_ = auVar74._0_4_;
                  auVar209._4_4_ = auVar209._0_4_;
                  auVar209._8_4_ = auVar209._0_4_;
                  auVar209._12_4_ = auVar209._0_4_;
                  auVar70 = vdivps_avx(auVar77,auVar209);
                  auVar77 = vdivps_avx(auVar71,auVar209);
                  auVar210._0_4_ = fVar220 * auVar70._0_4_ + fVar204 * auVar77._0_4_;
                  auVar210._4_4_ = fVar220 * auVar70._4_4_ + fVar204 * auVar77._4_4_;
                  auVar210._8_4_ = fVar220 * auVar70._8_4_ + fVar204 * auVar77._8_4_;
                  auVar210._12_4_ = fVar220 * auVar70._12_4_ + fVar204 * auVar77._12_4_;
                  auVar70 = vsubps_avx(local_800._0_16_,auVar210);
                  auVar160 = ZEXT1664(auVar70);
                  auVar20._8_4_ = 0x7fffffff;
                  auVar20._0_8_ = 0x7fffffff7fffffff;
                  auVar20._12_4_ = 0x7fffffff;
                  auVar77 = vandps_avx512vl(auVar72,auVar20);
                  if (auVar77._0_4_ < auVar254._0_4_) {
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ + auVar232._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar21._8_4_ = 0x7fffffff;
                    auVar21._0_8_ = 0x7fffffff7fffffff;
                    auVar21._12_4_ = 0x7fffffff;
                    auVar71 = vandps_avx512vl(ZEXT416((uint)fVar204),auVar21);
                    if (auVar71._0_4_ < auVar77._0_4_) {
                      fVar205 = auVar70._0_4_ + (float)local_930._0_4_;
                      if (fVar205 < fVar144) {
LAB_01d1e6e4:
                        bVar54 = 0;
                        goto LAB_01d1e70e;
                      }
                      fVar218 = *(float *)(ray + k * 4 + 0x200);
                      if (fVar205 <= fVar218) {
                        auVar70 = vmovshdup_avx(auVar70);
                        bVar54 = 0;
                        if ((auVar70._0_4_ < 0.0) || (1.0 < auVar70._0_4_)) goto LAB_01d1e70e;
                        auVar211._0_12_ = ZEXT812(0);
                        auVar211._12_4_ = 0;
                        auVar250._0_16_ = auVar211;
                        auVar133._4_60_ = auVar250._4_60_;
                        auVar133._0_4_ = fVar219;
                        auVar70 = vrsqrt14ss_avx512f(auVar211,auVar133._0_16_);
                        fVar219 = auVar70._0_4_;
                        auVar68 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01d1e6e4;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar54 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01d1e70e;
                        fVar219 = fVar219 * 1.5 + auVar68._0_4_ * fVar219 * fVar219 * fVar219;
                        auVar187._0_4_ = auVar1._0_4_ * fVar219;
                        auVar187._4_4_ = auVar1._4_4_ * fVar219;
                        auVar187._8_4_ = auVar1._8_4_ * fVar219;
                        auVar187._12_4_ = auVar1._12_4_ * fVar219;
                        auVar77 = vfmadd213ps_fma(auVar73,auVar187,auVar69);
                        auVar68 = vshufps_avx(auVar187,auVar187,0xc9);
                        auVar70 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar188._0_4_ = auVar187._0_4_ * auVar70._0_4_;
                        auVar188._4_4_ = auVar187._4_4_ * auVar70._4_4_;
                        auVar188._8_4_ = auVar187._8_4_ * auVar70._8_4_;
                        auVar188._12_4_ = auVar187._12_4_ * auVar70._12_4_;
                        auVar69 = vfmsub231ps_fma(auVar188,auVar69,auVar68);
                        auVar68 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar70 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                        auVar148._0_4_ = auVar77._0_4_ * auVar69._0_4_;
                        auVar148._4_4_ = auVar77._4_4_ * auVar69._4_4_;
                        auVar148._8_4_ = auVar77._8_4_ * auVar69._8_4_;
                        auVar148._12_4_ = auVar77._12_4_ * auVar69._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar148,auVar68,auVar70);
                        auVar250 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar250,auVar160);
                        auVar160 = vpermps_avx512f(auVar250,ZEXT1664(auVar68));
                        auVar250 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar250,ZEXT1664(auVar68));
                        local_380 = vbroadcastss_avx512f(auVar68);
                        local_400[0] = (RTCHitN)auVar160[0];
                        local_400[1] = (RTCHitN)auVar160[1];
                        local_400[2] = (RTCHitN)auVar160[2];
                        local_400[3] = (RTCHitN)auVar160[3];
                        local_400[4] = (RTCHitN)auVar160[4];
                        local_400[5] = (RTCHitN)auVar160[5];
                        local_400[6] = (RTCHitN)auVar160[6];
                        local_400[7] = (RTCHitN)auVar160[7];
                        local_400[8] = (RTCHitN)auVar160[8];
                        local_400[9] = (RTCHitN)auVar160[9];
                        local_400[10] = (RTCHitN)auVar160[10];
                        local_400[0xb] = (RTCHitN)auVar160[0xb];
                        local_400[0xc] = (RTCHitN)auVar160[0xc];
                        local_400[0xd] = (RTCHitN)auVar160[0xd];
                        local_400[0xe] = (RTCHitN)auVar160[0xe];
                        local_400[0xf] = (RTCHitN)auVar160[0xf];
                        local_400[0x10] = (RTCHitN)auVar160[0x10];
                        local_400[0x11] = (RTCHitN)auVar160[0x11];
                        local_400[0x12] = (RTCHitN)auVar160[0x12];
                        local_400[0x13] = (RTCHitN)auVar160[0x13];
                        local_400[0x14] = (RTCHitN)auVar160[0x14];
                        local_400[0x15] = (RTCHitN)auVar160[0x15];
                        local_400[0x16] = (RTCHitN)auVar160[0x16];
                        local_400[0x17] = (RTCHitN)auVar160[0x17];
                        local_400[0x18] = (RTCHitN)auVar160[0x18];
                        local_400[0x19] = (RTCHitN)auVar160[0x19];
                        local_400[0x1a] = (RTCHitN)auVar160[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar160[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar160[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar160[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar160[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar160[0x1f];
                        local_400[0x20] = (RTCHitN)auVar160[0x20];
                        local_400[0x21] = (RTCHitN)auVar160[0x21];
                        local_400[0x22] = (RTCHitN)auVar160[0x22];
                        local_400[0x23] = (RTCHitN)auVar160[0x23];
                        local_400[0x24] = (RTCHitN)auVar160[0x24];
                        local_400[0x25] = (RTCHitN)auVar160[0x25];
                        local_400[0x26] = (RTCHitN)auVar160[0x26];
                        local_400[0x27] = (RTCHitN)auVar160[0x27];
                        local_400[0x28] = (RTCHitN)auVar160[0x28];
                        local_400[0x29] = (RTCHitN)auVar160[0x29];
                        local_400[0x2a] = (RTCHitN)auVar160[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar160[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar160[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar160[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar160[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar160[0x2f];
                        local_400[0x30] = (RTCHitN)auVar160[0x30];
                        local_400[0x31] = (RTCHitN)auVar160[0x31];
                        local_400[0x32] = (RTCHitN)auVar160[0x32];
                        local_400[0x33] = (RTCHitN)auVar160[0x33];
                        local_400[0x34] = (RTCHitN)auVar160[0x34];
                        local_400[0x35] = (RTCHitN)auVar160[0x35];
                        local_400[0x36] = (RTCHitN)auVar160[0x36];
                        local_400[0x37] = (RTCHitN)auVar160[0x37];
                        local_400[0x38] = (RTCHitN)auVar160[0x38];
                        local_400[0x39] = (RTCHitN)auVar160[0x39];
                        local_400[0x3a] = (RTCHitN)auVar160[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar160[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar160[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar160[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar160[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar160[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar160 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar160);
                        vpcmpeqd_avx2(auVar160._0_32_,auVar160._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar205;
                        auVar160 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar160);
                        local_a70.valid = (int *)local_7c0;
                        local_a70.geometryUserPtr = pGVar3->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_400;
                        local_a70.N = 0x10;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar241 = ZEXT1664(auVar238);
                          auVar246 = ZEXT1664(auVar243);
                          auVar252 = ZEXT1664(auVar1);
                          auVar253 = ZEXT1664(auVar146);
                          (*pGVar3->occlusionFilterN)(&local_a70);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar259 = ZEXT3264(auVar80);
                          auVar160 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar14 = vptestmd_avx512f(auVar160,auVar160);
                        if ((short)uVar14 != 0) {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar241 = ZEXT1664(auVar241._0_16_);
                            auVar246 = ZEXT1664(auVar246._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            (*p_Var4)(&local_a70);
                            auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar259 = ZEXT3264(auVar80);
                            auVar160 = vmovdqa64_avx512f(local_7c0);
                          }
                          uVar66 = vptestmd_avx512f(auVar160,auVar160);
                          auVar160 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar11 = (bool)((byte)uVar66 & 1);
                          auVar134._0_4_ =
                               (uint)bVar11 * auVar160._0_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x200);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar134._4_4_ =
                               (uint)bVar11 * auVar160._4_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x204);
                          bVar11 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar134._8_4_ =
                               (uint)bVar11 * auVar160._8_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x208);
                          bVar11 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar134._12_4_ =
                               (uint)bVar11 * auVar160._12_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x20c);
                          bVar11 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar134._16_4_ =
                               (uint)bVar11 * auVar160._16_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x210);
                          bVar11 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar134._20_4_ =
                               (uint)bVar11 * auVar160._20_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x214);
                          bVar11 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar134._24_4_ =
                               (uint)bVar11 * auVar160._24_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x218);
                          bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar134._28_4_ =
                               (uint)bVar11 * auVar160._28_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x21c);
                          bVar11 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar134._32_4_ =
                               (uint)bVar11 * auVar160._32_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x220);
                          bVar11 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar134._36_4_ =
                               (uint)bVar11 * auVar160._36_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x224);
                          bVar11 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar134._40_4_ =
                               (uint)bVar11 * auVar160._40_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x228);
                          bVar11 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar134._44_4_ =
                               (uint)bVar11 * auVar160._44_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x22c);
                          bVar11 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar134._48_4_ =
                               (uint)bVar11 * auVar160._48_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x230);
                          bVar11 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar134._52_4_ =
                               (uint)bVar11 * auVar160._52_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x234);
                          bVar11 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar134._56_4_ =
                               (uint)bVar11 * auVar160._56_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x238);
                          bVar11 = SUB81(uVar66 >> 0xf,0);
                          auVar134._60_4_ =
                               (uint)bVar11 * auVar160._60_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar134;
                          bVar54 = 1;
                          if ((short)uVar66 != 0) goto LAB_01d1e70e;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar218;
                      }
                      bVar54 = 0;
                      goto LAB_01d1e70e;
                    }
                  }
                  bVar65 = uVar66 < 4;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != 5);
                bVar65 = false;
                bVar54 = 5;
LAB_01d1e70e:
                bVar62 = (bool)(bVar62 | bVar65 & bVar54);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar158._4_4_ = uVar162;
                auVar158._0_4_ = uVar162;
                auVar158._8_4_ = uVar162;
                auVar158._12_4_ = uVar162;
                auVar158._16_4_ = uVar162;
                auVar158._20_4_ = uVar162;
                auVar158._24_4_ = uVar162;
                auVar158._28_4_ = uVar162;
                auVar48._4_4_ = fStack_75c;
                auVar48._0_4_ = local_760;
                auVar48._8_4_ = fStack_758;
                auVar48._12_4_ = fStack_754;
                auVar48._16_4_ = fStack_750;
                auVar48._20_4_ = fStack_74c;
                auVar48._24_4_ = fStack_748;
                auVar48._28_4_ = fStack_744;
                uVar14 = vcmpps_avx512vl(auVar158,auVar48,0xd);
                bVar63 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar63 & (byte)uVar14;
                auVar80 = local_6c0;
              } while (bVar63 != 0);
            }
            auVar160 = ZEXT3264(local_700);
            bVar53 = local_780[0] | ~bVar53;
            auVar177._0_4_ = fVar161 + auVar80._0_4_;
            auVar177._4_4_ = fVar161 + auVar80._4_4_;
            auVar177._8_4_ = fVar161 + auVar80._8_4_;
            auVar177._12_4_ = fVar161 + auVar80._12_4_;
            auVar177._16_4_ = fVar161 + auVar80._16_4_;
            auVar177._20_4_ = fVar161 + auVar80._20_4_;
            auVar177._24_4_ = fVar161 + auVar80._24_4_;
            auVar177._28_4_ = fVar161 + auVar80._28_4_;
            uVar14 = vcmpps_avx512vl(auVar177,auVar158,2);
            bVar51 = (byte)uVar15 & bVar51 & (byte)uVar14;
            auVar178._8_4_ = 2;
            auVar178._0_8_ = 0x200000002;
            auVar178._12_4_ = 2;
            auVar178._16_4_ = 2;
            auVar178._20_4_ = 2;
            auVar178._24_4_ = 2;
            auVar178._28_4_ = 2;
            auVar29._8_4_ = 3;
            auVar29._0_8_ = 0x300000003;
            auVar29._12_4_ = 3;
            auVar29._16_4_ = 3;
            auVar29._20_4_ = 3;
            auVar29._24_4_ = 3;
            auVar29._28_4_ = 3;
            auVar80 = vpblendmd_avx512vl(auVar178,auVar29);
            auVar130._0_4_ = (uint)(bVar53 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
            bVar65 = (bool)(bVar53 >> 1 & 1);
            auVar130._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar53 >> 2 & 1);
            auVar130._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar53 >> 3 & 1);
            auVar130._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar53 >> 4 & 1);
            auVar130._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar53 >> 5 & 1);
            auVar130._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar53 >> 6 & 1);
            auVar130._24_4_ = (uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * 2;
            auVar130._28_4_ = (uint)(bVar53 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
            uVar14 = vpcmpd_avx512vl(local_720,auVar130,5);
            bVar53 = (byte)uVar14 & bVar51;
            if (bVar53 != 0) {
              auVar70 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar68 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar1 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar69 = vminps_avx(auVar70,auVar1);
              auVar70 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar1 = vmaxps_avx(auVar68,auVar70);
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx(auVar69,auVar189);
              auVar70 = vandps_avx(auVar1,auVar189);
              auVar68 = vmaxps_avx(auVar68,auVar70);
              auVar70 = vmovshdup_avx(auVar68);
              auVar70 = vmaxss_avx(auVar70,auVar68);
              auVar68 = vshufpd_avx(auVar68,auVar68,1);
              auVar68 = vmaxss_avx(auVar68,auVar70);
              fVar223 = auVar68._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar1,auVar1,0xff);
              local_760 = fVar161 + local_700._0_4_;
              fStack_75c = fVar161 + local_700._4_4_;
              fStack_758 = fVar161 + local_700._8_4_;
              fStack_754 = fVar161 + local_700._12_4_;
              fStack_750 = fVar161 + local_700._16_4_;
              fStack_74c = fVar161 + local_700._20_4_;
              fStack_748 = fVar161 + local_700._24_4_;
              fStack_744 = fVar161 + local_700._28_4_;
              _local_a40 = local_700;
              local_780 = auVar130;
              do {
                auVar159._8_4_ = 0x7f800000;
                auVar159._0_8_ = 0x7f8000007f800000;
                auVar159._12_4_ = 0x7f800000;
                auVar159._16_4_ = 0x7f800000;
                auVar159._20_4_ = 0x7f800000;
                auVar159._24_4_ = 0x7f800000;
                auVar159._28_4_ = 0x7f800000;
                auVar80 = vblendmps_avx512vl(auVar159,auVar160._0_32_);
                auVar131._0_4_ =
                     (uint)(bVar53 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
                bVar65 = (bool)(bVar53 >> 1 & 1);
                auVar131._4_4_ = (uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar53 >> 2 & 1);
                auVar131._8_4_ = (uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar53 >> 3 & 1);
                auVar131._12_4_ = (uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar53 >> 4 & 1);
                auVar131._16_4_ = (uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar53 >> 5 & 1);
                auVar131._20_4_ = (uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * 0x7f800000;
                auVar131._24_4_ =
                     (uint)(bVar53 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
                auVar131._28_4_ = 0x7f800000;
                auVar80 = vshufps_avx(auVar131,auVar131,0xb1);
                auVar80 = vminps_avx(auVar131,auVar80);
                auVar91 = vshufpd_avx(auVar80,auVar80,5);
                auVar80 = vminps_avx(auVar80,auVar91);
                auVar91 = vpermpd_avx2(auVar80,0x4e);
                auVar80 = vminps_avx(auVar80,auVar91);
                uVar14 = vcmpps_avx512vl(auVar131,auVar80,0);
                bVar54 = (byte)uVar14 & bVar53;
                bVar63 = bVar53;
                if (bVar54 != 0) {
                  bVar63 = bVar54;
                }
                iVar17 = 0;
                for (uVar67 = (uint)bVar63; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
                  iVar17 = iVar17 + 1;
                }
                uVar67 = *(uint *)(local_540 + (uint)(iVar17 << 2));
                uVar60 = *(uint *)(local_6e0 + (uint)(iVar17 << 2));
                fVar205 = auVar12._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_9e0._0_4_);
                }
                auVar68 = vinsertps_avx(ZEXT416(uVar60),ZEXT416(uVar67),0x10);
                auVar250 = ZEXT1664(auVar68);
                bVar65 = true;
                uVar66 = 0;
                do {
                  uVar162 = auVar250._0_4_;
                  auVar149._4_4_ = uVar162;
                  auVar149._0_4_ = uVar162;
                  auVar149._8_4_ = uVar162;
                  auVar149._12_4_ = uVar162;
                  auVar68 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_9d0);
                  auVar70 = vmovshdup_avx(auVar250._0_16_);
                  fVar234 = auVar70._0_4_;
                  fVar222 = 1.0 - fVar234;
                  fVar218 = fVar234 * fVar234;
                  auVar72 = SUB6416(ZEXT464(0x40400000),0);
                  auVar71 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar69 = vfmadd213ss_fma(auVar72,auVar70,auVar71);
                  auVar1 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar218),
                                           SUB6416(ZEXT464(0x40000000),0));
                  auVar77 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar222),auVar71);
                  auVar77 = vfmadd213ss_fma(auVar77,ZEXT416((uint)(fVar222 * fVar222)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar219 = fVar222 * fVar222 * -fVar234 * 0.5;
                  fVar220 = auVar1._0_4_ * 0.5;
                  fVar221 = auVar77._0_4_ * 0.5;
                  fVar204 = fVar234 * fVar234 * -fVar222 * 0.5;
                  auVar212._0_4_ = fVar204 * (float)local_9c0._0_4_;
                  auVar212._4_4_ = fVar204 * (float)local_9c0._4_4_;
                  auVar212._8_4_ = fVar204 * fStack_9b8;
                  auVar212._12_4_ = fVar204 * fStack_9b4;
                  auVar225._4_4_ = fVar221;
                  auVar225._0_4_ = fVar221;
                  auVar225._8_4_ = fVar221;
                  auVar225._12_4_ = fVar221;
                  auVar1 = vfmadd132ps_fma(auVar225,auVar212,local_980._0_16_);
                  auVar190._4_4_ = fVar220;
                  auVar190._0_4_ = fVar220;
                  auVar190._8_4_ = fVar220;
                  auVar190._12_4_ = fVar220;
                  auVar1 = vfmadd132ps_fma(auVar190,auVar1,local_9a0._0_16_);
                  auVar213._4_4_ = fVar219;
                  auVar213._0_4_ = fVar219;
                  auVar213._8_4_ = fVar219;
                  auVar213._12_4_ = fVar219;
                  auVar1 = vfmadd132ps_fma(auVar213,auVar1,local_960._0_16_);
                  auVar77 = vfmadd231ss_fma(auVar71,auVar70,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar77;
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar70,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar77;
                  auVar77 = vfmadd213ss_fma(auVar72,auVar70,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar77;
                  local_880._0_16_ = auVar1;
                  auVar1 = vsubps_avx(auVar68,auVar1);
                  auVar68 = vdpps_avx(auVar1,auVar1,0x7f);
                  fVar219 = auVar68._0_4_;
                  local_800 = auVar250;
                  if (fVar219 < 0.0) {
                    local_a00._0_4_ = fVar218;
                    local_a20._0_4_ = fVar222 * -2.0;
                    auVar252._0_4_ = sqrtf(fVar219);
                    auVar252._4_60_ = extraout_var_00;
                    auVar69 = ZEXT416(auVar69._0_4_);
                    auVar77 = auVar252._0_16_;
                  }
                  else {
                    auVar77 = vsqrtss_avx(auVar68,auVar68);
                    local_a20._0_4_ = fVar222 * -2.0;
                    local_a00._0_4_ = fVar218;
                  }
                  auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar234 * (fVar222 + fVar222))),
                                             ZEXT416((uint)fVar222),ZEXT416((uint)fVar222));
                  auVar69 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(fVar234 + fVar234)),
                                            ZEXT416((uint)(fVar234 * fVar234 * 3.0)));
                  auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar70,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * fVar222 * -3.0)),
                                            ZEXT416((uint)(fVar222 + fVar222)),auVar71);
                  auVar71 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar70,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar218 = auVar73._0_4_ * 0.5;
                  fVar220 = auVar69._0_4_ * 0.5;
                  fVar221 = auVar72._0_4_ * 0.5;
                  fVar204 = auVar71._0_4_ * 0.5;
                  auVar214._0_4_ = fVar204 * (float)local_9c0._0_4_;
                  auVar214._4_4_ = fVar204 * (float)local_9c0._4_4_;
                  auVar214._8_4_ = fVar204 * fStack_9b8;
                  auVar214._12_4_ = fVar204 * fStack_9b4;
                  auVar191._4_4_ = fVar221;
                  auVar191._0_4_ = fVar221;
                  auVar191._8_4_ = fVar221;
                  auVar191._12_4_ = fVar221;
                  auVar69 = vfmadd132ps_fma(auVar191,auVar214,local_980._0_16_);
                  auVar169._4_4_ = fVar220;
                  auVar169._0_4_ = fVar220;
                  auVar169._8_4_ = fVar220;
                  auVar169._12_4_ = fVar220;
                  auVar69 = vfmadd132ps_fma(auVar169,auVar69,local_9a0._0_16_);
                  auVar256._4_4_ = fVar218;
                  auVar256._0_4_ = fVar218;
                  auVar256._8_4_ = fVar218;
                  auVar256._12_4_ = fVar218;
                  auVar69 = vfmadd132ps_fma(auVar256,auVar69,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar69,auVar69,0x7f);
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT812(0);
                  fVar218 = local_a00._0_4_;
                  auVar71 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar218));
                  fVar220 = auVar71._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)fVar218));
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar72 = vxorps_avx512vl(local_a00._0_16_,auVar22);
                  auVar71 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar67 = auVar77._0_4_;
                  if (fVar218 < auVar72._0_4_) {
                    fVar221 = sqrtf(fVar218);
                    auVar77 = ZEXT416(uVar67);
                  }
                  else {
                    auVar72 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar221 = auVar72._0_4_;
                  }
                  fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
                  auVar150._0_4_ = auVar69._0_4_ * fVar218;
                  auVar150._4_4_ = auVar69._4_4_ * fVar218;
                  auVar150._8_4_ = auVar69._8_4_ * fVar218;
                  auVar150._12_4_ = auVar69._12_4_ * fVar218;
                  auVar72 = vdpps_avx(auVar1,auVar150,0x7f);
                  fVar222 = auVar77._0_4_;
                  fVar220 = auVar72._0_4_;
                  auVar151._0_4_ = fVar220 * fVar220;
                  auVar151._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                  auVar151._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                  auVar151._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                  auVar73 = vsubps_avx512vl(auVar68,auVar151);
                  fVar204 = auVar73._0_4_;
                  auVar170._4_12_ = ZEXT812(0) << 0x20;
                  auVar170._0_4_ = fVar204;
                  auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
                  auVar75 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
                  if (fVar204 < 0.0) {
                    local_910 = fVar218;
                    fStack_90c = fVar218;
                    fStack_908 = fVar218;
                    fStack_904 = fVar218;
                    local_900 = auVar74;
                    fVar204 = sqrtf(fVar204);
                    auVar75 = ZEXT416(auVar75._0_4_);
                    auVar77 = ZEXT416(uVar67);
                    auVar73 = local_900;
                    fVar218 = local_910;
                    fVar234 = fStack_90c;
                    fVar235 = fStack_908;
                    fVar236 = fStack_904;
                  }
                  else {
                    auVar73 = vsqrtss_avx(auVar73,auVar73);
                    fVar204 = auVar73._0_4_;
                    auVar73 = auVar74;
                    fVar234 = fVar218;
                    fVar235 = fVar218;
                    fVar236 = fVar218;
                  }
                  auVar252 = ZEXT1664(auVar1);
                  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar259 = ZEXT3264(auVar80);
                  auVar171._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar171._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar171._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar171._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar192._4_4_ = local_8c0._0_4_;
                  auVar192._0_4_ = local_8c0._0_4_;
                  auVar192._8_4_ = local_8c0._0_4_;
                  auVar192._12_4_ = local_8c0._0_4_;
                  auVar232 = vfmadd132ps_fma(auVar192,auVar171,local_980._0_16_);
                  auVar172._4_4_ = local_8a0._0_4_;
                  auVar172._0_4_ = local_8a0._0_4_;
                  auVar172._8_4_ = local_8a0._0_4_;
                  auVar172._12_4_ = local_8a0._0_4_;
                  auVar232 = vfmadd132ps_fma(auVar172,auVar232,local_9a0._0_16_);
                  auVar70 = vfmadd213ss_fma(auVar70,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar70._0_4_;
                  auVar193._4_4_ = uVar162;
                  auVar193._0_4_ = uVar162;
                  auVar193._8_4_ = uVar162;
                  auVar193._12_4_ = uVar162;
                  auVar70 = vfmadd132ps_fma(auVar193,auVar232,local_960._0_16_);
                  auVar173._0_4_ = auVar70._0_4_ * (float)local_a00._0_4_;
                  auVar173._4_4_ = auVar70._4_4_ * (float)local_a00._0_4_;
                  auVar173._8_4_ = auVar70._8_4_ * (float)local_a00._0_4_;
                  auVar173._12_4_ = auVar70._12_4_ * (float)local_a00._0_4_;
                  auVar70 = vdpps_avx(auVar69,auVar70,0x7f);
                  fVar179 = auVar70._0_4_;
                  auVar194._0_4_ = auVar69._0_4_ * fVar179;
                  auVar194._4_4_ = auVar69._4_4_ * fVar179;
                  auVar194._8_4_ = auVar69._8_4_ * fVar179;
                  auVar194._12_4_ = auVar69._12_4_ * fVar179;
                  auVar70 = vsubps_avx(auVar173,auVar194);
                  fVar179 = auVar71._0_4_ * (float)local_a20._0_4_;
                  auVar232 = vmaxss_avx(ZEXT416((uint)fVar223),
                                        ZEXT416((uint)(local_800._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar136._16_48_ = local_800._16_48_;
                  auVar76 = vxorps_avx512vl(auVar69,auVar23);
                  auVar195._0_4_ = fVar218 * auVar70._0_4_ * fVar179;
                  auVar195._4_4_ = fVar234 * auVar70._4_4_ * fVar179;
                  auVar195._8_4_ = fVar235 * auVar70._8_4_ * fVar179;
                  auVar195._12_4_ = fVar236 * auVar70._12_4_ * fVar179;
                  auVar253 = ZEXT1664(auVar150);
                  auVar70 = vdpps_avx(auVar76,auVar150,0x7f);
                  auVar71 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar223),auVar232);
                  auVar77 = vdpps_avx(auVar1,auVar195,0x7f);
                  auVar254 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),
                                             ZEXT416((uint)(fVar223 / fVar221)),auVar71);
                  fVar218 = auVar70._0_4_ + auVar77._0_4_;
                  auVar70 = vdpps_avx(local_9d0,auVar150,0x7f);
                  auVar77 = vdpps_avx(auVar1,auVar76,0x7f);
                  auVar71 = vmulss_avx512f(auVar75,auVar73);
                  fVar221 = auVar74._0_4_ * 1.5 + auVar71._0_4_ * auVar73._0_4_ * auVar73._0_4_;
                  auVar71 = vdpps_avx(auVar1,local_9d0,0x7f);
                  auVar74 = vfnmadd231ss_fma(auVar77,auVar72,ZEXT416((uint)fVar218));
                  auVar71 = vfnmadd231ss_fma(auVar71,auVar72,auVar70);
                  auVar77 = vpermilps_avx(local_880._0_16_,0xff);
                  fVar204 = fVar204 - auVar77._0_4_;
                  auVar73 = vshufps_avx(auVar69,auVar69,0xff);
                  auVar77 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar221),auVar73);
                  auVar244._8_4_ = 0x80000000;
                  auVar244._0_8_ = 0x8000000080000000;
                  auVar244._12_4_ = 0x80000000;
                  auVar246 = ZEXT1664(auVar244);
                  auVar239._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                  auVar239._8_4_ = auVar77._8_4_ ^ 0x80000000;
                  auVar239._12_4_ = auVar77._12_4_ ^ 0x80000000;
                  auVar241 = ZEXT1664(auVar239);
                  auVar71 = ZEXT416((uint)(auVar71._0_4_ * fVar221));
                  auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar77._0_4_)),
                                            ZEXT416((uint)fVar218),auVar71);
                  auVar77 = vinsertps_avx(auVar239,auVar71,0x1c);
                  auVar230._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
                  auVar230._8_4_ = auVar70._8_4_ ^ 0x80000000;
                  auVar230._12_4_ = auVar70._12_4_ ^ 0x80000000;
                  auVar71 = vinsertps_avx(ZEXT416((uint)fVar218),auVar230,0x10);
                  auVar215._0_4_ = auVar74._0_4_;
                  auVar215._4_4_ = auVar215._0_4_;
                  auVar215._8_4_ = auVar215._0_4_;
                  auVar215._12_4_ = auVar215._0_4_;
                  auVar70 = vdivps_avx(auVar77,auVar215);
                  auVar77 = vdivps_avx(auVar71,auVar215);
                  auVar216._0_4_ = fVar220 * auVar70._0_4_ + fVar204 * auVar77._0_4_;
                  auVar216._4_4_ = fVar220 * auVar70._4_4_ + fVar204 * auVar77._4_4_;
                  auVar216._8_4_ = fVar220 * auVar70._8_4_ + fVar204 * auVar77._8_4_;
                  auVar216._12_4_ = fVar220 * auVar70._12_4_ + fVar204 * auVar77._12_4_;
                  auVar70 = vsubps_avx(local_800._0_16_,auVar216);
                  auVar250 = ZEXT1664(auVar70);
                  auVar24._8_4_ = 0x7fffffff;
                  auVar24._0_8_ = 0x7fffffff7fffffff;
                  auVar24._12_4_ = 0x7fffffff;
                  auVar77 = vandps_avx512vl(auVar72,auVar24);
                  if (auVar77._0_4_ < auVar254._0_4_) {
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ + auVar232._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar25._8_4_ = 0x7fffffff;
                    auVar25._0_8_ = 0x7fffffff7fffffff;
                    auVar25._12_4_ = 0x7fffffff;
                    auVar71 = vandps_avx512vl(ZEXT416((uint)fVar204),auVar25);
                    if (auVar71._0_4_ < auVar77._0_4_) {
                      fVar205 = auVar70._0_4_ + (float)local_930._0_4_;
                      if (fVar205 < fVar144) {
                        bVar63 = 0;
                        goto LAB_01d1f3a0;
                      }
                      fVar218 = *(float *)(ray + k * 4 + 0x200);
                      auVar241 = ZEXT464((uint)fVar218);
                      auVar160 = ZEXT3264(_local_a40);
                      if (fVar205 <= fVar218) {
                        auVar70 = vmovshdup_avx(auVar70);
                        bVar63 = 0;
                        if ((auVar70._0_4_ < 0.0) || (1.0 < auVar70._0_4_)) goto LAB_01d1f3a9;
                        auVar217._0_12_ = ZEXT812(0);
                        auVar217._12_4_ = 0;
                        auVar136._0_16_ = auVar217;
                        auVar135._4_60_ = auVar136._4_60_;
                        auVar135._0_4_ = fVar219;
                        auVar70 = vrsqrt14ss_avx512f(auVar217,auVar135._0_16_);
                        fVar219 = auVar70._0_4_;
                        auVar68 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar64].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                          bVar63 = 0;
                          goto LAB_01d1f3a9;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar63 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01d1f3a9;
                        fVar219 = fVar219 * 1.5 + auVar68._0_4_ * fVar219 * fVar219 * fVar219;
                        auVar196._0_4_ = auVar1._0_4_ * fVar219;
                        auVar196._4_4_ = auVar1._4_4_ * fVar219;
                        auVar196._8_4_ = auVar1._8_4_ * fVar219;
                        auVar196._12_4_ = auVar1._12_4_ * fVar219;
                        auVar77 = vfmadd213ps_fma(auVar73,auVar196,auVar69);
                        auVar68 = vshufps_avx(auVar196,auVar196,0xc9);
                        auVar70 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar197._0_4_ = auVar196._0_4_ * auVar70._0_4_;
                        auVar197._4_4_ = auVar196._4_4_ * auVar70._4_4_;
                        auVar197._8_4_ = auVar196._8_4_ * auVar70._8_4_;
                        auVar197._12_4_ = auVar196._12_4_ * auVar70._12_4_;
                        auVar69 = vfmsub231ps_fma(auVar197,auVar69,auVar68);
                        auVar68 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar70 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                        auVar152._0_4_ = auVar77._0_4_ * auVar69._0_4_;
                        auVar152._4_4_ = auVar77._4_4_ * auVar69._4_4_;
                        auVar152._8_4_ = auVar77._8_4_ * auVar69._8_4_;
                        auVar152._12_4_ = auVar77._12_4_ * auVar69._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar152,auVar68,auVar70);
                        auVar241 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar241,auVar250);
                        auVar241 = vpermps_avx512f(auVar241,ZEXT1664(auVar68));
                        auVar250 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar250,ZEXT1664(auVar68));
                        local_380 = vbroadcastss_avx512f(auVar68);
                        local_400[0] = (RTCHitN)auVar241[0];
                        local_400[1] = (RTCHitN)auVar241[1];
                        local_400[2] = (RTCHitN)auVar241[2];
                        local_400[3] = (RTCHitN)auVar241[3];
                        local_400[4] = (RTCHitN)auVar241[4];
                        local_400[5] = (RTCHitN)auVar241[5];
                        local_400[6] = (RTCHitN)auVar241[6];
                        local_400[7] = (RTCHitN)auVar241[7];
                        local_400[8] = (RTCHitN)auVar241[8];
                        local_400[9] = (RTCHitN)auVar241[9];
                        local_400[10] = (RTCHitN)auVar241[10];
                        local_400[0xb] = (RTCHitN)auVar241[0xb];
                        local_400[0xc] = (RTCHitN)auVar241[0xc];
                        local_400[0xd] = (RTCHitN)auVar241[0xd];
                        local_400[0xe] = (RTCHitN)auVar241[0xe];
                        local_400[0xf] = (RTCHitN)auVar241[0xf];
                        local_400[0x10] = (RTCHitN)auVar241[0x10];
                        local_400[0x11] = (RTCHitN)auVar241[0x11];
                        local_400[0x12] = (RTCHitN)auVar241[0x12];
                        local_400[0x13] = (RTCHitN)auVar241[0x13];
                        local_400[0x14] = (RTCHitN)auVar241[0x14];
                        local_400[0x15] = (RTCHitN)auVar241[0x15];
                        local_400[0x16] = (RTCHitN)auVar241[0x16];
                        local_400[0x17] = (RTCHitN)auVar241[0x17];
                        local_400[0x18] = (RTCHitN)auVar241[0x18];
                        local_400[0x19] = (RTCHitN)auVar241[0x19];
                        local_400[0x1a] = (RTCHitN)auVar241[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar241[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar241[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar241[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar241[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar241[0x1f];
                        local_400[0x20] = (RTCHitN)auVar241[0x20];
                        local_400[0x21] = (RTCHitN)auVar241[0x21];
                        local_400[0x22] = (RTCHitN)auVar241[0x22];
                        local_400[0x23] = (RTCHitN)auVar241[0x23];
                        local_400[0x24] = (RTCHitN)auVar241[0x24];
                        local_400[0x25] = (RTCHitN)auVar241[0x25];
                        local_400[0x26] = (RTCHitN)auVar241[0x26];
                        local_400[0x27] = (RTCHitN)auVar241[0x27];
                        local_400[0x28] = (RTCHitN)auVar241[0x28];
                        local_400[0x29] = (RTCHitN)auVar241[0x29];
                        local_400[0x2a] = (RTCHitN)auVar241[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar241[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar241[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar241[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar241[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar241[0x2f];
                        local_400[0x30] = (RTCHitN)auVar241[0x30];
                        local_400[0x31] = (RTCHitN)auVar241[0x31];
                        local_400[0x32] = (RTCHitN)auVar241[0x32];
                        local_400[0x33] = (RTCHitN)auVar241[0x33];
                        local_400[0x34] = (RTCHitN)auVar241[0x34];
                        local_400[0x35] = (RTCHitN)auVar241[0x35];
                        local_400[0x36] = (RTCHitN)auVar241[0x36];
                        local_400[0x37] = (RTCHitN)auVar241[0x37];
                        local_400[0x38] = (RTCHitN)auVar241[0x38];
                        local_400[0x39] = (RTCHitN)auVar241[0x39];
                        local_400[0x3a] = (RTCHitN)auVar241[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar241[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar241[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar241[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar241[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar241[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar241 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar241);
                        vpcmpeqd_avx2(auVar241._0_32_,auVar241._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar205;
                        auVar250 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar250);
                        local_a70.valid = (int *)local_7c0;
                        local_a70.geometryUserPtr = pGVar3->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_400;
                        local_a70.N = 0x10;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar246 = ZEXT1664(auVar244);
                          auVar252 = ZEXT1664(auVar1);
                          auVar253 = ZEXT1664(auVar150);
                          (*pGVar3->occlusionFilterN)(&local_a70);
                          auVar160 = ZEXT3264(_local_a40);
                          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar259 = ZEXT3264(auVar80);
                          auVar250 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar14 = vptestmd_avx512f(auVar250,auVar250);
                        if ((short)uVar14 != 0) {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar246 = ZEXT1664(auVar246._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            (*p_Var4)(&local_a70);
                            auVar160 = ZEXT3264(_local_a40);
                            auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar259 = ZEXT3264(auVar80);
                            auVar250 = vmovdqa64_avx512f(local_7c0);
                          }
                          auVar241 = ZEXT464((uint)fVar218);
                          uVar66 = vptestmd_avx512f(auVar250,auVar250);
                          auVar250 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar11 = (bool)((byte)uVar66 & 1);
                          auVar137._0_4_ =
                               (uint)bVar11 * auVar250._0_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x200);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar137._4_4_ =
                               (uint)bVar11 * auVar250._4_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x204);
                          bVar11 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar137._8_4_ =
                               (uint)bVar11 * auVar250._8_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x208);
                          bVar11 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar137._12_4_ =
                               (uint)bVar11 * auVar250._12_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x20c);
                          bVar11 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar137._16_4_ =
                               (uint)bVar11 * auVar250._16_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x210);
                          bVar11 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar137._20_4_ =
                               (uint)bVar11 * auVar250._20_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x214);
                          bVar11 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar137._24_4_ =
                               (uint)bVar11 * auVar250._24_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x218);
                          bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar137._28_4_ =
                               (uint)bVar11 * auVar250._28_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x21c);
                          bVar11 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar137._32_4_ =
                               (uint)bVar11 * auVar250._32_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x220);
                          bVar11 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar137._36_4_ =
                               (uint)bVar11 * auVar250._36_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x224);
                          bVar11 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar137._40_4_ =
                               (uint)bVar11 * auVar250._40_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x228);
                          bVar11 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar137._44_4_ =
                               (uint)bVar11 * auVar250._44_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x22c);
                          bVar11 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar137._48_4_ =
                               (uint)bVar11 * auVar250._48_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x230);
                          bVar11 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar137._52_4_ =
                               (uint)bVar11 * auVar250._52_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x234);
                          bVar11 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar137._56_4_ =
                               (uint)bVar11 * auVar250._56_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x238);
                          bVar11 = SUB81(uVar66 >> 0xf,0);
                          auVar137._60_4_ =
                               (uint)bVar11 * auVar250._60_4_ |
                               (uint)!bVar11 * *(int *)(local_a70.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar137;
                          bVar63 = 1;
                          if ((short)uVar66 != 0) goto LAB_01d1f3a9;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar218;
                      }
                      auVar241 = ZEXT464((uint)fVar218);
                      bVar63 = 0;
                      goto LAB_01d1f3a9;
                    }
                  }
                  bVar65 = uVar66 < 4;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != 5);
                bVar65 = false;
                bVar63 = 5;
LAB_01d1f3a0:
                auVar160 = ZEXT3264(_local_a40);
LAB_01d1f3a9:
                bVar62 = (bool)(bVar62 | bVar65 & bVar63);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar158._4_4_ = uVar162;
                auVar158._0_4_ = uVar162;
                auVar158._8_4_ = uVar162;
                auVar158._12_4_ = uVar162;
                auVar158._16_4_ = uVar162;
                auVar158._20_4_ = uVar162;
                auVar158._24_4_ = uVar162;
                auVar158._28_4_ = uVar162;
                auVar49._4_4_ = fStack_75c;
                auVar49._0_4_ = local_760;
                auVar49._8_4_ = fStack_758;
                auVar49._12_4_ = fStack_754;
                auVar49._16_4_ = fStack_750;
                auVar49._20_4_ = fStack_74c;
                auVar49._24_4_ = fStack_748;
                auVar49._28_4_ = fStack_744;
                uVar14 = vcmpps_avx512vl(auVar158,auVar49,0xd);
                bVar53 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar53 & (byte)uVar14;
                auVar130 = local_780;
              } while (bVar53 != 0);
            }
            uVar15 = vpcmpgtd_avx512vl(auVar130,local_720);
            uVar16 = vpcmpd_avx512vl(local_720,local_6a0,1);
            auVar202._0_4_ = fVar161 + (float)local_440._0_4_;
            auVar202._4_4_ = fVar161 + (float)local_440._4_4_;
            auVar202._8_4_ = fVar161 + fStack_438;
            auVar202._12_4_ = fVar161 + fStack_434;
            auVar202._16_4_ = fVar161 + fStack_430;
            auVar202._20_4_ = fVar161 + fStack_42c;
            auVar202._24_4_ = fVar161 + fStack_428;
            auVar202._28_4_ = fVar161 + fStack_424;
            uVar14 = vcmpps_avx512vl(auVar202,auVar158,2);
            bVar57 = bVar57 & (byte)uVar16 & (byte)uVar14;
            auVar203._0_4_ = fVar161 + local_700._0_4_;
            auVar203._4_4_ = fVar161 + local_700._4_4_;
            auVar203._8_4_ = fVar161 + local_700._8_4_;
            auVar203._12_4_ = fVar161 + local_700._12_4_;
            auVar203._16_4_ = fVar161 + local_700._16_4_;
            auVar203._20_4_ = fVar161 + local_700._20_4_;
            auVar203._24_4_ = fVar161 + local_700._24_4_;
            auVar203._28_4_ = fVar161 + local_700._28_4_;
            uVar14 = vcmpps_avx512vl(auVar203,auVar158,2);
            bVar51 = bVar51 & (byte)uVar15 & (byte)uVar14 | bVar57;
            prim = local_8f0;
            if (bVar51 != 0) {
              uVar56 = (ulong)uVar59;
              abStack_1a0[uVar56 * 0x60] = bVar51;
              auVar132._0_4_ =
                   (uint)(bVar57 & 1) * local_440._0_4_ |
                   (uint)!(bool)(bVar57 & 1) * (int)local_700._0_4_;
              bVar65 = (bool)(bVar57 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar65 * local_440._4_4_ | (uint)!bVar65 * (int)local_700._4_4_
              ;
              bVar65 = (bool)(bVar57 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar65 * (int)fStack_438 | (uint)!bVar65 * (int)local_700._8_4_
              ;
              bVar65 = (bool)(bVar57 >> 3 & 1);
              auVar132._12_4_ =
                   (uint)bVar65 * (int)fStack_434 | (uint)!bVar65 * (int)local_700._12_4_;
              bVar65 = (bool)(bVar57 >> 4 & 1);
              auVar132._16_4_ =
                   (uint)bVar65 * (int)fStack_430 | (uint)!bVar65 * (int)local_700._16_4_;
              bVar65 = (bool)(bVar57 >> 5 & 1);
              auVar132._20_4_ =
                   (uint)bVar65 * (int)fStack_42c | (uint)!bVar65 * (int)local_700._20_4_;
              auVar132._24_4_ =
                   (uint)(bVar57 >> 6) * (int)fStack_428 |
                   (uint)!(bool)(bVar57 >> 6) * (int)local_700._24_4_;
              auVar132._28_4_ = local_700._28_4_;
              *(undefined1 (*) [32])(auStack_180 + uVar56 * 0x60) = auVar132;
              uVar66 = vmovlps_avx(local_730);
              (&uStack_160)[uVar56 * 0xc] = uVar66;
              aiStack_158[uVar56 * 0x18] = local_cfc + 1;
              uVar59 = uVar59 + 1;
            }
          }
        }
      }
    }
    do {
      uVar67 = uVar59;
      uVar60 = uVar67 - 1;
      if (uVar67 == 0) {
        if (bVar62 != false) {
          return bVar62;
        }
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar31._4_4_ = uVar162;
        auVar31._0_4_ = uVar162;
        auVar31._8_4_ = uVar162;
        auVar31._12_4_ = uVar162;
        auVar31._16_4_ = uVar162;
        auVar31._20_4_ = uVar162;
        auVar31._24_4_ = uVar162;
        auVar31._28_4_ = uVar162;
        uVar14 = vcmpps_avx512vl(local_680,auVar31,2);
        uVar64 = (uint)local_8e8 & (uint)uVar14;
        local_8e8 = (ulong)uVar64;
        if (uVar64 == 0) {
          return false;
        }
        goto LAB_01d1ce7b;
      }
      uVar66 = (ulong)uVar60;
      lVar58 = uVar66 * 0x60;
      auVar80 = *(undefined1 (*) [32])(auStack_180 + lVar58);
      auVar175._0_4_ = fVar161 + auVar80._0_4_;
      auVar175._4_4_ = fVar161 + auVar80._4_4_;
      auVar175._8_4_ = fVar161 + auVar80._8_4_;
      auVar175._12_4_ = fVar161 + auVar80._12_4_;
      auVar175._16_4_ = fVar161 + auVar80._16_4_;
      auVar175._20_4_ = fVar161 + auVar80._20_4_;
      auVar175._24_4_ = fVar161 + auVar80._24_4_;
      auVar175._28_4_ = fVar161 + auVar80._28_4_;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar30._4_4_ = uVar162;
      auVar30._0_4_ = uVar162;
      auVar30._8_4_ = uVar162;
      auVar30._12_4_ = uVar162;
      auVar30._16_4_ = uVar162;
      auVar30._20_4_ = uVar162;
      auVar30._24_4_ = uVar162;
      auVar30._28_4_ = uVar162;
      uVar14 = vcmpps_avx512vl(auVar175,auVar30,2);
      uVar55 = (uint)uVar14 & (uint)abStack_1a0[lVar58];
      uVar59 = uVar60;
    } while (uVar55 == 0);
    uVar56 = (&uStack_160)[uVar66 * 0xc];
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar56;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar201,auVar80);
    bVar51 = (byte)uVar55;
    auVar128._0_4_ =
         (uint)(bVar51 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar51 & 1) * (int)auVar80._0_4_;
    bVar65 = (bool)((byte)(uVar55 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar65 * auVar91._4_4_ | (uint)!bVar65 * (int)auVar80._4_4_;
    bVar65 = (bool)((byte)(uVar55 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar65 * auVar91._8_4_ | (uint)!bVar65 * (int)auVar80._8_4_;
    bVar65 = (bool)((byte)(uVar55 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar65 * auVar91._12_4_ | (uint)!bVar65 * (int)auVar80._12_4_;
    bVar65 = (bool)((byte)(uVar55 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar65 * auVar91._16_4_ | (uint)!bVar65 * (int)auVar80._16_4_;
    bVar65 = (bool)((byte)(uVar55 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar65 * auVar91._20_4_ | (uint)!bVar65 * (int)auVar80._20_4_;
    bVar65 = (bool)((byte)(uVar55 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar65 * auVar91._24_4_ | (uint)!bVar65 * (int)auVar80._24_4_;
    auVar128._28_4_ =
         (uVar55 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar55 >> 7,0) * (int)auVar80._28_4_;
    auVar80 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar80 = vminps_avx(auVar128,auVar80);
    auVar91 = vshufpd_avx(auVar80,auVar80,5);
    auVar80 = vminps_avx(auVar80,auVar91);
    auVar91 = vpermpd_avx2(auVar80,0x4e);
    auVar80 = vminps_avx(auVar80,auVar91);
    uVar14 = vcmpps_avx512vl(auVar128,auVar80,0);
    bVar53 = (byte)uVar14 & bVar51;
    if (bVar53 != 0) {
      uVar55 = (uint)bVar53;
    }
    uVar138 = 0;
    for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
      uVar138 = uVar138 + 1;
    }
    local_cfc = aiStack_158[uVar66 * 0x18];
    bVar51 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar51;
    abStack_1a0[lVar58] = bVar51;
    uVar59 = uVar67;
    if (bVar51 == 0) {
      uVar59 = uVar60;
    }
    uVar162 = (undefined4)uVar56;
    auVar155._4_4_ = uVar162;
    auVar155._0_4_ = uVar162;
    auVar155._8_4_ = uVar162;
    auVar155._12_4_ = uVar162;
    auVar155._16_4_ = uVar162;
    auVar155._20_4_ = uVar162;
    auVar155._24_4_ = uVar162;
    auVar155._28_4_ = uVar162;
    auVar68 = vmovshdup_avx(auVar163);
    auVar68 = vsubps_avx(auVar68,auVar163);
    auVar176._0_4_ = auVar68._0_4_;
    auVar176._4_4_ = auVar176._0_4_;
    auVar176._8_4_ = auVar176._0_4_;
    auVar176._12_4_ = auVar176._0_4_;
    auVar176._16_4_ = auVar176._0_4_;
    auVar176._20_4_ = auVar176._0_4_;
    auVar176._24_4_ = auVar176._0_4_;
    auVar176._28_4_ = auVar176._0_4_;
    auVar68 = vfmadd132ps_fma(auVar176,auVar155,_DAT_01faff20);
    auVar80 = ZEXT1632(auVar68);
    local_400[0] = (RTCHitN)auVar80[0];
    local_400[1] = (RTCHitN)auVar80[1];
    local_400[2] = (RTCHitN)auVar80[2];
    local_400[3] = (RTCHitN)auVar80[3];
    local_400[4] = (RTCHitN)auVar80[4];
    local_400[5] = (RTCHitN)auVar80[5];
    local_400[6] = (RTCHitN)auVar80[6];
    local_400[7] = (RTCHitN)auVar80[7];
    local_400[8] = (RTCHitN)auVar80[8];
    local_400[9] = (RTCHitN)auVar80[9];
    local_400[10] = (RTCHitN)auVar80[10];
    local_400[0xb] = (RTCHitN)auVar80[0xb];
    local_400[0xc] = (RTCHitN)auVar80[0xc];
    local_400[0xd] = (RTCHitN)auVar80[0xd];
    local_400[0xe] = (RTCHitN)auVar80[0xe];
    local_400[0xf] = (RTCHitN)auVar80[0xf];
    local_400[0x10] = (RTCHitN)auVar80[0x10];
    local_400[0x11] = (RTCHitN)auVar80[0x11];
    local_400[0x12] = (RTCHitN)auVar80[0x12];
    local_400[0x13] = (RTCHitN)auVar80[0x13];
    local_400[0x14] = (RTCHitN)auVar80[0x14];
    local_400[0x15] = (RTCHitN)auVar80[0x15];
    local_400[0x16] = (RTCHitN)auVar80[0x16];
    local_400[0x17] = (RTCHitN)auVar80[0x17];
    local_400[0x18] = (RTCHitN)auVar80[0x18];
    local_400[0x19] = (RTCHitN)auVar80[0x19];
    local_400[0x1a] = (RTCHitN)auVar80[0x1a];
    local_400[0x1b] = (RTCHitN)auVar80[0x1b];
    local_400[0x1c] = (RTCHitN)auVar80[0x1c];
    local_400[0x1d] = (RTCHitN)auVar80[0x1d];
    local_400[0x1e] = (RTCHitN)auVar80[0x1e];
    local_400[0x1f] = (RTCHitN)auVar80[0x1f];
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_400 + (ulong)uVar138 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }